

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  byte bVar61;
  uint uVar62;
  ulong uVar63;
  uint uVar64;
  undefined4 uVar65;
  undefined8 unaff_RBP;
  long lVar66;
  long lVar67;
  float fVar68;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar94;
  undefined8 uVar95;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  float fVar139;
  float fVar140;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar141;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar144;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar143;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar180;
  float fVar181;
  vint4 bi;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar182;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vint4 ai;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  float fVar218;
  vint4 ai_1;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar219;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar233;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar260;
  float fVar261;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar262;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar275;
  float fVar288;
  float fVar289;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar290;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar295 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar291;
  float fVar302;
  float fVar303;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar304;
  undefined1 auVar294 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar326 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  int local_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [32];
  ulong local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 auStack_418 [16];
  undefined1 local_408 [32];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 auStack_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  Primitive *local_300;
  RTCFilterFunctionNArguments local_2f8;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined1 local_2b8 [16];
  uint auStack_2a8 [4];
  undefined8 local_298;
  float local_290;
  undefined8 local_28c;
  uint local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar60;
  undefined1 auVar325 [32];
  
  local_558[0] = prim[1];
  uVar58 = (ulong)(byte)local_558[0];
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  lVar67 = uVar58 * 0x25;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar295 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)local_558[0] * 0x10 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x11 + 6)));
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  fVar68 = *(float *)(prim + lVar67 + 0x12);
  auVar157 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar67 + 6));
  fVar94 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
           *(float *)(prim + lVar67 + 0x1a);
  auVar263._0_4_ = fVar68 * auVar157._0_4_;
  auVar263._4_4_ = fVar68 * auVar157._4_4_;
  auVar263._8_4_ = fVar68 * auVar157._8_4_;
  auVar263._12_4_ = fVar68 * auVar157._12_4_;
  auVar305._0_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar305._4_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar305._8_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar305._12_4_ = fVar68 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar157 = vshufps_avx(auVar305,auVar305,0x55);
  auVar283 = vshufps_avx(auVar305,auVar305,0xaa);
  fVar68 = auVar283._0_4_;
  auVar276._0_4_ = fVar68 * auVar17._0_4_;
  fVar144 = auVar283._4_4_;
  auVar276._4_4_ = fVar144 * auVar17._4_4_;
  fVar143 = auVar283._8_4_;
  auVar276._8_4_ = fVar143 * auVar17._8_4_;
  fVar92 = auVar283._12_4_;
  auVar276._12_4_ = fVar92 * auVar17._12_4_;
  auVar247._0_4_ = fVar68 * auVar18._0_4_;
  auVar247._4_4_ = fVar144 * auVar18._4_4_;
  auVar247._8_4_ = fVar143 * auVar18._8_4_;
  auVar247._12_4_ = fVar92 * auVar18._12_4_;
  auVar234._0_4_ = fVar68 * auVar169._0_4_;
  auVar234._4_4_ = fVar144 * auVar169._4_4_;
  auVar234._8_4_ = fVar143 * auVar169._8_4_;
  auVar234._12_4_ = fVar92 * auVar169._12_4_;
  auVar69 = vfmadd231ps_fma(auVar276,auVar157,auVar16);
  auVar154 = vfmadd231ps_fma(auVar247,auVar157,auVar158);
  auVar97 = vfmadd231ps_fma(auVar234,auVar19,auVar157);
  auVar157 = vshufps_avx(auVar263,auVar263,0xaa);
  fVar68 = auVar157._0_4_;
  auVar165._0_4_ = fVar68 * auVar17._0_4_;
  fVar144 = auVar157._4_4_;
  auVar165._4_4_ = fVar144 * auVar17._4_4_;
  fVar143 = auVar157._8_4_;
  auVar165._8_4_ = fVar143 * auVar17._8_4_;
  fVar92 = auVar157._12_4_;
  auVar165._12_4_ = fVar92 * auVar17._12_4_;
  auVar145._0_4_ = fVar68 * auVar18._0_4_;
  auVar145._4_4_ = fVar144 * auVar18._4_4_;
  auVar145._8_4_ = fVar143 * auVar18._8_4_;
  auVar145._12_4_ = fVar92 * auVar18._12_4_;
  auVar123._0_4_ = fVar68 * auVar169._0_4_;
  auVar123._4_4_ = fVar144 * auVar169._4_4_;
  auVar123._8_4_ = fVar143 * auVar169._8_4_;
  auVar123._12_4_ = fVar92 * auVar169._12_4_;
  auVar17 = vshufps_avx(auVar263,auVar263,0x55);
  auVar169 = vfmadd231ps_fma(auVar165,auVar17,auVar16);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar157 = vpmovsxwd_avx(auVar16);
  auVar98 = vfmadd231ps_fma(auVar145,auVar17,auVar158);
  auVar123 = vfmadd231ps_fma(auVar123,auVar17,auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar283 = vpmovsxwd_avx(auVar17);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar158);
  auVar16 = vcvtdq2ps_avx(auVar15);
  auVar17 = vcvtdq2ps_avx(auVar295);
  auVar158 = vcvtdq2ps_avx(auVar194);
  auVar306._4_4_ = auVar305._0_4_;
  auVar306._0_4_ = auVar305._0_4_;
  auVar306._8_4_ = auVar305._0_4_;
  auVar306._12_4_ = auVar305._0_4_;
  auVar15 = vfmadd231ps_fma(auVar69,auVar306,auVar16);
  auVar295 = vfmadd231ps_fma(auVar154,auVar306,auVar17);
  auVar154 = vfmadd231ps_fma(auVar97,auVar158,auVar306);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar194 = vpmovsxwd_avx(auVar18);
  auVar264._4_4_ = auVar263._0_4_;
  auVar264._0_4_ = auVar263._0_4_;
  auVar264._8_4_ = auVar263._0_4_;
  auVar264._12_4_ = auVar263._0_4_;
  auVar124 = vfmadd231ps_fma(auVar169,auVar264,auVar16);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar69 = vpmovsxwd_avx(auVar19);
  auVar98 = vfmadd231ps_fma(auVar98,auVar264,auVar17);
  auVar123 = vfmadd231ps_fma(auVar123,auVar264,auVar158);
  local_2b8._8_4_ = 0x7fffffff;
  local_2b8._0_8_ = 0x7fffffff7fffffff;
  local_2b8._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar15,local_2b8);
  auVar265._8_4_ = 0x219392ef;
  auVar265._0_8_ = 0x219392ef219392ef;
  auVar265._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar265,1);
  auVar17 = vblendvps_avx(auVar15,auVar265,auVar16);
  auVar16 = vandps_avx(auVar295,local_2b8);
  auVar16 = vcmpps_avx(auVar16,auVar265,1);
  auVar158 = vblendvps_avx(auVar295,auVar265,auVar16);
  auVar16 = vandps_avx(auVar154,local_2b8);
  auVar16 = vcmpps_avx(auVar16,auVar265,1);
  auVar16 = vblendvps_avx(auVar154,auVar265,auVar16);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar58 * 0x16 + 6);
  auVar169 = vpmovsxwd_avx(auVar169);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar277._4_4_ = fVar94;
  auVar277._0_4_ = fVar94;
  auVar277._8_4_ = fVar94;
  auVar277._12_4_ = fVar94;
  auVar18 = vcvtdq2ps_avx(auVar157);
  auVar19 = vcvtdq2ps_avx(auVar283);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar154 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar295._8_8_ = 0;
  auVar295._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar295 = vpmovsxwd_avx(auVar295);
  auVar18 = vcvtdq2ps_avx(auVar20);
  auVar19 = vcvtdq2ps_avx(auVar194);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar97 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar69);
  auVar19 = vcvtdq2ps_avx(auVar169);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar169 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar15);
  auVar19 = vcvtdq2ps_avx(auVar295);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar15 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar18 = vpmovsxwd_avx(auVar194);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar58 * 0x21 + 6);
  auVar19 = vpmovsxwd_avx(auVar157);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar295 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + uVar58 * 0x1f + 6);
  auVar18 = vpmovsxwd_avx(auVar283);
  local_300 = prim;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar20);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar19 = vfmadd213ps_fma(auVar19,auVar277,auVar18);
  auVar18 = vrcpps_avx(auVar17);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar18,auVar96);
  auVar18 = vfmadd132ps_fma(auVar17,auVar18,auVar18);
  auVar17 = vrcpps_avx(auVar158);
  auVar158 = vfnmadd213ps_fma(auVar158,auVar17,auVar96);
  auVar158 = vfmadd132ps_fma(auVar158,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar96);
  auVar17 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vsubps_avx(auVar154,auVar124);
  auVar183._0_4_ = auVar18._0_4_ * auVar16._0_4_;
  auVar183._4_4_ = auVar18._4_4_ * auVar16._4_4_;
  auVar183._8_4_ = auVar18._8_4_ * auVar16._8_4_;
  auVar183._12_4_ = auVar18._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar97,auVar124);
  auVar166._0_4_ = auVar18._0_4_ * auVar16._0_4_;
  auVar166._4_4_ = auVar18._4_4_ * auVar16._4_4_;
  auVar166._8_4_ = auVar18._8_4_ * auVar16._8_4_;
  auVar166._12_4_ = auVar18._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar169,auVar98);
  auVar203._0_4_ = auVar158._0_4_ * auVar16._0_4_;
  auVar203._4_4_ = auVar158._4_4_ * auVar16._4_4_;
  auVar203._8_4_ = auVar158._8_4_ * auVar16._8_4_;
  auVar203._12_4_ = auVar158._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar15,auVar98);
  auVar97._0_4_ = auVar158._0_4_ * auVar16._0_4_;
  auVar97._4_4_ = auVar158._4_4_ * auVar16._4_4_;
  auVar97._8_4_ = auVar158._8_4_ * auVar16._8_4_;
  auVar97._12_4_ = auVar158._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar295,auVar123);
  auVar146._0_4_ = auVar17._0_4_ * auVar16._0_4_;
  auVar146._4_4_ = auVar17._4_4_ * auVar16._4_4_;
  auVar146._8_4_ = auVar17._8_4_ * auVar16._8_4_;
  auVar146._12_4_ = auVar17._12_4_ * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar19,auVar123);
  auVar69._0_4_ = auVar17._0_4_ * auVar16._0_4_;
  auVar69._4_4_ = auVar17._4_4_ * auVar16._4_4_;
  auVar69._8_4_ = auVar17._8_4_ * auVar16._8_4_;
  auVar69._12_4_ = auVar17._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar183,auVar166);
  auVar17 = vpminsd_avx(auVar203,auVar97);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vpminsd_avx(auVar146,auVar69);
  uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar235._4_4_ = uVar65;
  auVar235._0_4_ = uVar65;
  auVar235._8_4_ = uVar65;
  auVar235._12_4_ = uVar65;
  auVar17 = vmaxps_avx(auVar17,auVar235);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  local_268._0_4_ = auVar16._0_4_ * 0.99999964;
  local_268._4_4_ = auVar16._4_4_ * 0.99999964;
  local_268._8_4_ = auVar16._8_4_ * 0.99999964;
  local_268._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar183,auVar166);
  auVar17 = vpmaxsd_avx(auVar203,auVar97);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar17 = vpmaxsd_avx(auVar146,auVar69);
  fVar68 = (ray->super_RayK<1>).tfar;
  auVar124._4_4_ = fVar68;
  auVar124._0_4_ = fVar68;
  auVar124._8_4_ = fVar68;
  auVar124._12_4_ = fVar68;
  auVar17 = vminps_avx(auVar17,auVar124);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar154._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar154._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar154._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar154._12_4_ = auVar16._12_4_ * 1.0000004;
  local_558._1_3_ = 0;
  auVar98[4] = local_558[0];
  auVar98._0_4_ = local_558._0_4_;
  auVar98._5_3_ = 0;
  auVar98[8] = local_558[0];
  auVar98._9_3_ = 0;
  auVar98[0xc] = local_558[0];
  auVar98._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar98,_DAT_01f4ad30);
  auVar16 = vcmpps_avx(local_268,auVar154,2);
  auVar16 = vandps_avx(auVar16,auVar17);
  auVar118._16_16_ = mm_lookupmask_ps._240_16_;
  auVar118._0_16_ = mm_lookupmask_ps._240_16_;
  uVar65 = vmovmskps_avx(auVar16);
  uVar58 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar65);
  local_1b8 = vblendps_avx(auVar118,ZEXT832(0) << 0x20,0x80);
LAB_012350e7:
  if (uVar58 == 0) {
    return;
  }
  lVar67 = 0;
  for (uVar59 = uVar58; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar57 = *(uint *)(local_300 + 2);
  pGVar7 = (context->scene->geometries).items[uVar57].ptr;
  fVar68 = (pGVar7->time_range).lower;
  fVar144 = pGVar7->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar68) /
            ((pGVar7->time_range).upper - fVar68));
  auVar16 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
  auVar16 = vminss_avx(auVar16,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar157 = vmaxss_avx(ZEXT816(0),auVar16);
  local_430 = (ulong)*(uint *)(local_300 + lVar67 * 4 + 6);
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_300 + lVar67 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar157._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar66);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar66);
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar59);
  lVar67 = uVar59 + 1;
  auVar17 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar67);
  lVar1 = uVar59 + 2;
  auVar158 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar59 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar54 = *pauVar3;
  fVar68 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar66);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar66);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar59);
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar67);
  auVar169 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar94 = *pfVar4;
  fVar143 = pfVar4[1];
  fVar92 = pfVar4[2];
  fVar142 = pfVar4[3];
  auVar283 = ZEXT816(0) << 0x40;
  auVar278._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar278._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar278._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar278._12_4_ = fVar68 * 0.0;
  auVar292._8_4_ = 0x3e2aaaab;
  auVar292._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar292._12_4_ = 0x3e2aaaab;
  auVar69 = vfmadd213ps_fma(auVar292,auVar158,auVar278);
  auVar315._8_4_ = 0x3f000000;
  auVar315._0_8_ = 0x3f0000003f000000;
  auVar315._12_4_ = 0x3f000000;
  auVar15 = vfmadd231ps_fma(auVar278,auVar158,auVar315);
  auVar15 = vfnmadd231ps_fma(auVar15,auVar17,auVar283);
  auVar165 = vfnmadd231ps_fma(auVar15,auVar16,auVar315);
  auVar184._0_4_ = fVar94 * 0.0;
  auVar184._4_4_ = fVar143 * 0.0;
  auVar184._8_4_ = fVar92 * 0.0;
  auVar184._12_4_ = fVar142 * 0.0;
  auVar15 = vfmadd213ps_fma(auVar292,auVar169,auVar184);
  auVar147._8_4_ = 0x3f2aaaab;
  auVar147._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar147._12_4_ = 0x3f2aaaab;
  auVar15 = vfmadd231ps_fma(auVar15,auVar19,auVar147);
  auVar15 = vfmadd231ps_fma(auVar15,auVar18,auVar292);
  auVar295 = vfmadd231ps_fma(auVar184,auVar169,auVar315);
  auVar295 = vfnmadd231ps_fma(auVar295,auVar19,auVar283);
  auVar194 = vfnmadd231ps_fma(auVar295,auVar18,auVar315);
  auVar293._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar293._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar293._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar293._12_4_ = fVar68 * 0.5;
  auVar295 = vfmadd231ps_fma(auVar293,auVar283,auVar158);
  auVar295 = vfnmadd231ps_fma(auVar295,auVar315,auVar17);
  auVar166 = vfnmadd231ps_fma(auVar295,auVar283,auVar16);
  auVar236._0_4_ = fVar94 * 0.16666667;
  auVar236._4_4_ = fVar143 * 0.16666667;
  auVar236._8_4_ = fVar92 * 0.16666667;
  auVar236._12_4_ = fVar142 * 0.16666667;
  auVar295 = vfmadd231ps_fma(auVar236,auVar169,auVar147);
  auVar295 = vfmadd231ps_fma(auVar295,auVar19,auVar292);
  auVar295 = vfmadd231ps_fma(auVar295,auVar18,auVar283);
  auVar204._0_4_ = fVar94 * 0.5;
  auVar204._4_4_ = fVar143 * 0.5;
  auVar204._8_4_ = fVar92 * 0.5;
  auVar204._12_4_ = fVar142 * 0.5;
  auVar169 = vfmadd231ps_fma(auVar204,auVar283,auVar169);
  auVar19 = vfnmadd231ps_fma(auVar169,auVar315,auVar19);
  auVar169 = vfnmadd231ps_fma(auVar19,auVar283,auVar18);
  auVar18 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar19 = vshufps_avx(auVar15,auVar15,0xc9);
  fVar275 = auVar165._0_4_;
  auVar99._0_4_ = fVar275 * auVar19._0_4_;
  fVar288 = auVar165._4_4_;
  auVar99._4_4_ = fVar288 * auVar19._4_4_;
  fVar289 = auVar165._8_4_;
  auVar99._8_4_ = fVar289 * auVar19._8_4_;
  fVar290 = auVar165._12_4_;
  auVar99._12_4_ = fVar290 * auVar19._12_4_;
  auVar97 = vfmsub231ps_fma(auVar99,auVar18,auVar15);
  auVar19 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar100._0_4_ = fVar275 * auVar19._0_4_;
  auVar100._4_4_ = fVar288 * auVar19._4_4_;
  auVar100._8_4_ = fVar289 * auVar19._8_4_;
  auVar100._12_4_ = fVar290 * auVar19._12_4_;
  auVar98 = vfmsub231ps_fma(auVar100,auVar18,auVar194);
  auVar18 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar19 = vshufps_avx(auVar295,auVar295,0xc9);
  fVar291 = auVar166._0_4_;
  auVar101._0_4_ = fVar291 * auVar19._0_4_;
  fVar302 = auVar166._4_4_;
  auVar101._4_4_ = fVar302 * auVar19._4_4_;
  fVar303 = auVar166._8_4_;
  auVar101._8_4_ = fVar303 * auVar19._8_4_;
  fVar304 = auVar166._12_4_;
  auVar101._12_4_ = fVar304 * auVar19._12_4_;
  auVar123 = vfmsub231ps_fma(auVar101,auVar18,auVar295);
  auVar19 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar102._0_4_ = fVar291 * auVar19._0_4_;
  auVar102._4_4_ = fVar302 * auVar19._4_4_;
  auVar102._8_4_ = fVar303 * auVar19._8_4_;
  auVar102._12_4_ = fVar304 * auVar19._12_4_;
  auVar124 = vfmsub231ps_fma(auVar102,auVar18,auVar169);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar66);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar66);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar55 = *pauVar3;
  fVar142 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar66);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar66);
  auVar248._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar248._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar248._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar248._12_4_ = fVar142 * 0.0;
  auVar154 = vfmadd213ps_fma(auVar292,auVar18,auVar248);
  auVar169 = vfmadd231ps_fma(auVar248,auVar18,auVar315);
  auVar19 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar67);
  auVar15 = vfnmadd231ps_fma(auVar169,auVar19,ZEXT816(0) << 0x20);
  auVar169 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar59);
  auVar183 = vfnmadd231ps_fma(auVar15,auVar169,auVar315);
  auVar15 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar94 = *pfVar4;
  fVar143 = pfVar4[1];
  fVar92 = pfVar4[2];
  fVar122 = pfVar4[3];
  auVar70._0_4_ = fVar94 * 0.0;
  auVar70._4_4_ = fVar143 * 0.0;
  auVar70._8_4_ = fVar92 * 0.0;
  auVar70._12_4_ = fVar122 * 0.0;
  auVar194 = vfmadd213ps_fma(auVar292,auVar15,auVar70);
  auVar295 = *(undefined1 (*) [16])(lVar12 + lVar67 * lVar9);
  auVar185._8_4_ = 0x3f2aaaab;
  auVar185._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar185._12_4_ = 0x3f2aaaab;
  auVar283 = vfmadd231ps_fma(auVar194,auVar295,auVar185);
  auVar194 = *(undefined1 (*) [16])(lVar12 + uVar59 * lVar9);
  auVar20 = vfmadd231ps_fma(auVar283,auVar194,auVar292);
  auVar283 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar246 = auVar183._0_4_;
  auVar186._0_4_ = fVar246 * auVar283._0_4_;
  fVar260 = auVar183._4_4_;
  auVar186._4_4_ = fVar260 * auVar283._4_4_;
  fVar261 = auVar183._8_4_;
  auVar186._8_4_ = fVar261 * auVar283._8_4_;
  fVar262 = auVar183._12_4_;
  auVar186._12_4_ = fVar262 * auVar283._12_4_;
  auVar283 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar96 = vfmsub231ps_fma(auVar186,auVar283,auVar20);
  auVar20 = vfmadd231ps_fma(auVar70,auVar15,auVar315);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar295,_DAT_01f45a50);
  auVar145 = vfnmadd231ps_fma(auVar20,auVar194,auVar315);
  auVar20 = vshufps_avx(auVar145,auVar145,0xc9);
  auVar187._0_4_ = fVar246 * auVar20._0_4_;
  auVar187._4_4_ = fVar260 * auVar20._4_4_;
  auVar187._8_4_ = fVar261 * auVar20._8_4_;
  auVar187._12_4_ = fVar262 * auVar20._12_4_;
  auVar20 = vfmsub231ps_fma(auVar187,auVar283,auVar145);
  auVar103._8_4_ = 0x3e2aaaab;
  auVar103._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar103._12_4_ = 0x3e2aaaab;
  auVar71._0_4_ = fVar94 * 0.16666667;
  auVar71._4_4_ = fVar143 * 0.16666667;
  auVar71._8_4_ = fVar92 * 0.16666667;
  auVar71._12_4_ = fVar122 * 0.16666667;
  auVar188._8_4_ = 0x3f2aaaab;
  auVar188._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar188._12_4_ = 0x3f2aaaab;
  auVar283 = vfmadd231ps_fma(auVar71,auVar15,auVar188);
  auVar148._0_4_ = fVar94 * 0.5;
  auVar148._4_4_ = fVar143 * 0.5;
  auVar148._8_4_ = fVar92 * 0.5;
  auVar148._12_4_ = fVar122 * 0.5;
  auVar145 = ZEXT816(0) << 0x20;
  auVar15 = vfmadd231ps_fma(auVar148,auVar145,auVar15);
  auVar283 = vfmadd231ps_fma(auVar283,auVar295,auVar103);
  auVar15 = vfnmadd231ps_fma(auVar15,auVar315,auVar295);
  auVar295 = vfmadd231ps_fma(auVar283,auVar194,auVar145);
  auVar194 = vfnmadd231ps_fma(auVar15,auVar145,auVar194);
  auVar205._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar205._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar205._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar205._12_4_ = fVar142 * 0.5;
  auVar15 = vfmadd231ps_fma(auVar205,auVar145,auVar18);
  auVar15 = vfnmadd231ps_fma(auVar15,auVar315,auVar19);
  auVar203 = vfnmadd231ps_fma(auVar15,auVar145,auVar169);
  auVar15 = vshufps_avx(auVar295,auVar295,0xc9);
  fVar233 = auVar203._0_4_;
  auVar167._0_4_ = fVar233 * auVar15._0_4_;
  fVar93 = auVar203._4_4_;
  auVar167._4_4_ = fVar93 * auVar15._4_4_;
  fVar218 = auVar203._8_4_;
  auVar167._8_4_ = fVar218 * auVar15._8_4_;
  fVar219 = auVar203._12_4_;
  auVar167._12_4_ = fVar219 * auVar15._12_4_;
  auVar15 = vshufps_avx(auVar203,auVar203,0xc9);
  auVar145 = vfmsub231ps_fma(auVar167,auVar15,auVar295);
  auVar295 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar72._0_4_ = fVar233 * auVar295._0_4_;
  auVar72._4_4_ = fVar93 * auVar295._4_4_;
  auVar72._8_4_ = fVar218 * auVar295._8_4_;
  auVar72._12_4_ = fVar219 * auVar295._12_4_;
  auVar146 = vfmsub231ps_fma(auVar72,auVar15,auVar194);
  fVar144 = fVar144 - auVar157._0_4_;
  local_518._0_4_ = auVar54._0_4_;
  local_518._4_4_ = auVar54._4_4_;
  fStack_510 = auVar54._8_4_;
  auVar104._0_4_ = (float)local_518._0_4_ * 0.16666667;
  auVar104._4_4_ = (float)local_518._4_4_ * 0.16666667;
  auVar104._8_4_ = fStack_510 * 0.16666667;
  auVar104._12_4_ = fVar68 * 0.16666667;
  auVar158 = vfmadd231ps_fma(auVar104,auVar188,auVar158);
  auVar15 = vfmadd231ps_fma(auVar69,auVar17,auVar188);
  auVar17 = vfmadd231ps_fma(auVar158,auVar17,auVar103);
  auVar157 = vfmadd231ps_fma(auVar15,auVar16,auVar103);
  auVar50._12_4_ = 0;
  auVar50._0_12_ = ZEXT812(0);
  auVar283 = vfmadd231ps_fma(auVar17,auVar16,auVar50 << 0x20);
  auVar158 = vpermilps_avx(auVar97,0xc9);
  auVar16 = vdpps_avx(auVar158,auVar158,0x7f);
  fVar94 = auVar16._0_4_;
  auVar295 = ZEXT416((uint)fVar94);
  auVar17 = vrsqrtss_avx(auVar295,auVar295);
  fVar68 = auVar17._0_4_;
  auVar15 = vpermilps_avx(auVar98,0xc9);
  auVar17 = vdpps_avx(auVar158,auVar15,0x7f);
  fVar68 = fVar94 * -0.5 * fVar68 * fVar68 * fVar68 + fVar68 * 1.5;
  auVar237._0_4_ = fVar94 * auVar15._0_4_;
  auVar237._4_4_ = fVar94 * auVar15._4_4_;
  auVar237._8_4_ = fVar94 * auVar15._8_4_;
  auVar237._12_4_ = fVar94 * auVar15._12_4_;
  fVar94 = auVar17._0_4_;
  auVar189._0_4_ = fVar94 * auVar158._0_4_;
  auVar189._4_4_ = fVar94 * auVar158._4_4_;
  auVar189._8_4_ = fVar94 * auVar158._8_4_;
  auVar189._12_4_ = fVar94 * auVar158._12_4_;
  auVar15 = vsubps_avx(auVar237,auVar189);
  auVar17 = vrcpss_avx(auVar295,auVar295);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,SUB6416(ZEXT464(0x40000000),0));
  fVar143 = auVar17._0_4_ * auVar16._0_4_;
  auVar295 = vpermilps_avx(auVar123,0xc9);
  auVar17 = vdpps_avx(auVar295,auVar295,0x7f);
  fVar122 = auVar158._0_4_ * fVar68;
  fVar139 = auVar158._4_4_ * fVar68;
  fVar140 = auVar158._8_4_ * fVar68;
  fVar141 = auVar158._12_4_ * fVar68;
  auVar16 = vblendps_avx(auVar17,_DAT_01f45a50,0xe);
  auVar158 = vrsqrtss_avx(auVar16,auVar16);
  fVar92 = auVar17._0_4_;
  fVar94 = auVar158._0_4_;
  fVar94 = fVar94 * 1.5 + fVar92 * -0.5 * fVar94 * fVar94 * fVar94;
  auVar194 = vpermilps_avx(auVar124,0xc9);
  auVar158 = vdpps_avx(auVar295,auVar194,0x7f);
  auVar220._0_4_ = auVar194._0_4_ * fVar92;
  auVar220._4_4_ = auVar194._4_4_ * fVar92;
  auVar220._8_4_ = auVar194._8_4_ * fVar92;
  auVar220._12_4_ = auVar194._12_4_ * fVar92;
  fVar92 = auVar158._0_4_;
  auVar307._0_4_ = fVar92 * auVar295._0_4_;
  auVar307._4_4_ = fVar92 * auVar295._4_4_;
  auVar307._8_4_ = fVar92 * auVar295._8_4_;
  auVar307._12_4_ = fVar92 * auVar295._12_4_;
  auVar158 = vsubps_avx(auVar220,auVar307);
  auVar16 = vrcpss_avx(auVar16,auVar16);
  auVar69 = SUB6416(ZEXT464(0x40000000),0);
  auVar17 = vfnmadd213ss_fma(auVar17,auVar16,auVar69);
  fVar92 = auVar16._0_4_ * auVar17._0_4_;
  fVar164 = auVar295._0_4_ * fVar94;
  fVar180 = auVar295._4_4_ * fVar94;
  fVar181 = auVar295._8_4_ * fVar94;
  fVar182 = auVar295._12_4_ * fVar94;
  auVar16 = vshufps_avx(auVar165,auVar165,0xff);
  auVar17 = vshufps_avx(auVar157,auVar157,0xff);
  auVar238._0_4_ = auVar17._0_4_ * fVar122;
  auVar238._4_4_ = auVar17._4_4_ * fVar139;
  auVar238._8_4_ = auVar17._8_4_ * fVar140;
  auVar238._12_4_ = auVar17._12_4_ * fVar141;
  auVar73._0_4_ = auVar16._0_4_ * fVar122 + auVar17._0_4_ * fVar68 * fVar143 * auVar15._0_4_;
  auVar73._4_4_ = auVar16._4_4_ * fVar139 + auVar17._4_4_ * fVar68 * fVar143 * auVar15._4_4_;
  auVar73._8_4_ = auVar16._8_4_ * fVar140 + auVar17._8_4_ * fVar68 * fVar143 * auVar15._8_4_;
  auVar73._12_4_ = auVar16._12_4_ * fVar141 + auVar17._12_4_ * fVar68 * fVar143 * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar157,auVar238);
  local_558._0_4_ = auVar157._0_4_ + auVar238._0_4_;
  local_558._4_4_ = auVar157._4_4_ + auVar238._4_4_;
  fStack_550 = auVar157._8_4_ + auVar238._8_4_;
  fStack_54c = auVar157._12_4_ + auVar238._12_4_;
  auVar295 = vsubps_avx(auVar165,auVar73);
  auVar16 = vshufps_avx(auVar166,auVar166,0xff);
  auVar17 = vshufps_avx(auVar283,auVar283,0xff);
  auVar168._0_4_ = auVar17._0_4_ * fVar164;
  auVar168._4_4_ = auVar17._4_4_ * fVar180;
  auVar168._8_4_ = auVar17._8_4_ * fVar181;
  auVar168._12_4_ = auVar17._12_4_ * fVar182;
  auVar149._0_4_ = auVar16._0_4_ * fVar164 + auVar17._0_4_ * fVar94 * auVar158._0_4_ * fVar92;
  auVar149._4_4_ = auVar16._4_4_ * fVar180 + auVar17._4_4_ * fVar94 * auVar158._4_4_ * fVar92;
  auVar149._8_4_ = auVar16._8_4_ * fVar181 + auVar17._8_4_ * fVar94 * auVar158._8_4_ * fVar92;
  auVar149._12_4_ = auVar16._12_4_ * fVar182 + auVar17._12_4_ * fVar94 * auVar158._12_4_ * fVar92;
  auVar158 = vsubps_avx(auVar283,auVar168);
  local_518._4_4_ = auVar283._4_4_ + auVar168._4_4_;
  local_518._0_4_ = auVar283._0_4_ + auVar168._0_4_;
  fStack_510 = auVar283._8_4_ + auVar168._8_4_;
  fStack_50c = auVar283._12_4_ + auVar168._12_4_;
  auVar194 = vsubps_avx(auVar166,auVar149);
  auVar74._8_4_ = 0x3e2aaaab;
  auVar74._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar74._12_4_ = 0x3e2aaaab;
  local_348._0_4_ = auVar55._0_4_;
  local_348._4_4_ = auVar55._4_4_;
  fStack_340 = auVar55._8_4_;
  auVar308._0_4_ = (float)local_348._0_4_ * 0.16666667;
  auVar308._4_4_ = (float)local_348._4_4_ * 0.16666667;
  auVar308._8_4_ = fStack_340 * 0.16666667;
  auVar308._12_4_ = fVar142 * 0.16666667;
  auVar125._8_4_ = 0x3f2aaaab;
  auVar125._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar125._12_4_ = 0x3f2aaaab;
  auVar16 = vfmadd231ps_fma(auVar308,auVar125,auVar18);
  auVar17 = vfmadd231ps_fma(auVar154,auVar19,auVar125);
  auVar16 = vfmadd231ps_fma(auVar16,auVar19,auVar74);
  auVar157 = vfmadd231ps_fma(auVar17,auVar169,auVar74);
  auVar283 = vfmadd231ps_fma(auVar16,auVar169,ZEXT816(0) << 0x20);
  auVar19 = vpermilps_avx(auVar96,0xc9);
  auVar16 = vdpps_avx(auVar19,auVar19,0x7f);
  fVar94 = auVar16._0_4_;
  auVar169 = ZEXT416((uint)fVar94);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar17 = vrsqrtss_avx(auVar169,auVar169);
  fVar68 = auVar17._0_4_;
  auVar18 = vpermilps_avx(auVar20,0xc9);
  auVar17 = vdpps_avx(auVar19,auVar18,0x7f);
  fVar68 = fVar68 * 1.5 + fVar68 * fVar68 * fVar94 * -0.5 * fVar68;
  auVar221._0_4_ = auVar18._0_4_ * fVar94;
  auVar221._4_4_ = auVar18._4_4_ * fVar94;
  auVar221._8_4_ = auVar18._8_4_ * fVar94;
  auVar221._12_4_ = auVar18._12_4_ * fVar94;
  fVar94 = auVar17._0_4_;
  auVar239._0_4_ = fVar94 * auVar19._0_4_;
  auVar239._4_4_ = fVar94 * auVar19._4_4_;
  auVar239._8_4_ = fVar94 * auVar19._8_4_;
  auVar239._12_4_ = fVar94 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar221,auVar239);
  auVar17 = vrcpss_avx(auVar169,auVar169);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,auVar69);
  fVar143 = auVar17._0_4_ * auVar16._0_4_;
  auVar169 = vpermilps_avx(auVar145,0xc9);
  auVar16 = vdpps_avx(auVar169,auVar169,0x7f);
  fVar142 = auVar19._0_4_ * fVar68;
  fVar122 = auVar19._4_4_ * fVar68;
  fVar139 = auVar19._8_4_ * fVar68;
  fVar140 = auVar19._12_4_ * fVar68;
  fVar92 = auVar16._0_4_;
  auVar170._4_12_ = SUB1612(auVar51 << 0x40,4);
  auVar170._0_4_ = fVar92;
  auVar17 = vrsqrtss_avx(auVar170,auVar170);
  fVar94 = auVar17._0_4_;
  fVar94 = fVar92 * -0.5 * fVar94 * fVar94 * fVar94 + fVar94 * 1.5;
  auVar19 = vpermilps_avx(auVar146,0xc9);
  auVar17 = vdpps_avx(auVar169,auVar19,0x7f);
  auVar279._0_4_ = fVar92 * auVar19._0_4_;
  auVar279._4_4_ = fVar92 * auVar19._4_4_;
  auVar279._8_4_ = fVar92 * auVar19._8_4_;
  auVar279._12_4_ = fVar92 * auVar19._12_4_;
  fVar92 = auVar17._0_4_;
  auVar316._0_4_ = fVar92 * auVar169._0_4_;
  auVar316._4_4_ = fVar92 * auVar169._4_4_;
  auVar316._8_4_ = fVar92 * auVar169._8_4_;
  auVar316._12_4_ = fVar92 * auVar169._12_4_;
  auVar19 = vsubps_avx(auVar279,auVar316);
  auVar17 = vrcpss_avx(auVar170,auVar170);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar17,auVar69);
  fVar92 = auVar16._0_4_ * auVar17._0_4_;
  fVar141 = auVar169._0_4_ * fVar94;
  fVar164 = auVar169._4_4_ * fVar94;
  fVar180 = auVar169._8_4_ * fVar94;
  fVar181 = auVar169._12_4_ * fVar94;
  auVar16 = vshufps_avx(auVar183,auVar183,0xff);
  auVar17 = vshufps_avx(auVar157,auVar157,0xff);
  auVar150._0_4_ = auVar17._0_4_ * fVar142;
  auVar150._4_4_ = auVar17._4_4_ * fVar122;
  auVar150._8_4_ = auVar17._8_4_ * fVar139;
  auVar150._12_4_ = auVar17._12_4_ * fVar140;
  auVar105._0_4_ = auVar16._0_4_ * fVar142 + auVar17._0_4_ * fVar68 * fVar143 * auVar18._0_4_;
  auVar105._4_4_ = auVar16._4_4_ * fVar122 + auVar17._4_4_ * fVar68 * fVar143 * auVar18._4_4_;
  auVar105._8_4_ = auVar16._8_4_ * fVar139 + auVar17._8_4_ * fVar68 * fVar143 * auVar18._8_4_;
  auVar105._12_4_ = auVar16._12_4_ * fVar140 + auVar17._12_4_ * fVar68 * fVar143 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar157,auVar150);
  fVar143 = auVar157._0_4_ + auVar150._0_4_;
  fVar142 = auVar157._4_4_ + auVar150._4_4_;
  fVar122 = auVar157._8_4_ + auVar150._8_4_;
  fVar139 = auVar157._12_4_ + auVar150._12_4_;
  auVar169 = vsubps_avx(auVar183,auVar105);
  auVar16 = vshufps_avx(auVar203,auVar203,0xff);
  auVar17 = vshufps_avx(auVar283,auVar283,0xff);
  auVar249._0_4_ = auVar17._0_4_ * fVar141;
  auVar249._4_4_ = auVar17._4_4_ * fVar164;
  auVar249._8_4_ = auVar17._8_4_ * fVar180;
  auVar249._12_4_ = auVar17._12_4_ * fVar181;
  auVar106._0_4_ = auVar16._0_4_ * fVar141 + auVar17._0_4_ * fVar94 * auVar19._0_4_ * fVar92;
  auVar106._4_4_ = auVar16._4_4_ * fVar164 + auVar17._4_4_ * fVar94 * auVar19._4_4_ * fVar92;
  auVar106._8_4_ = auVar16._8_4_ * fVar180 + auVar17._8_4_ * fVar94 * auVar19._8_4_ * fVar92;
  auVar106._12_4_ = auVar16._12_4_ * fVar181 + auVar17._12_4_ * fVar94 * auVar19._12_4_ * fVar92;
  auVar16 = vsubps_avx(auVar283,auVar249);
  auVar171._0_4_ = auVar283._0_4_ + auVar249._0_4_;
  auVar171._4_4_ = auVar283._4_4_ + auVar249._4_4_;
  auVar171._8_4_ = auVar283._8_4_ + auVar249._8_4_;
  auVar171._12_4_ = auVar283._12_4_ + auVar249._12_4_;
  auVar17 = vsubps_avx(auVar203,auVar106);
  local_428._0_4_ = auVar295._0_4_;
  local_428._4_4_ = auVar295._4_4_;
  fStack_420 = auVar295._8_4_;
  fStack_41c = auVar295._12_4_;
  auVar206._0_4_ = auVar15._0_4_ + (float)local_428._0_4_ * 0.33333334;
  auVar206._4_4_ = auVar15._4_4_ + (float)local_428._4_4_ * 0.33333334;
  auVar206._8_4_ = auVar15._8_4_ + fStack_420 * 0.33333334;
  auVar206._12_4_ = auVar15._12_4_ + fStack_41c * 0.33333334;
  fVar68 = 1.0 - fVar144;
  auVar107._4_4_ = fVar68;
  auVar107._0_4_ = fVar68;
  auVar107._8_4_ = fVar68;
  auVar107._12_4_ = fVar68;
  auVar280._0_4_ = fVar144 * auVar18._0_4_;
  auVar280._4_4_ = fVar144 * auVar18._4_4_;
  auVar280._8_4_ = fVar144 * auVar18._8_4_;
  auVar280._12_4_ = fVar144 * auVar18._12_4_;
  local_358 = vfmadd231ps_fma(auVar280,auVar107,auVar15);
  auVar126._0_4_ = fVar144 * (auVar18._0_4_ + auVar169._0_4_ * 0.33333334);
  auVar126._4_4_ = fVar144 * (auVar18._4_4_ + auVar169._4_4_ * 0.33333334);
  auVar126._8_4_ = fVar144 * (auVar18._8_4_ + auVar169._8_4_ * 0.33333334);
  auVar126._12_4_ = fVar144 * (auVar18._12_4_ + auVar169._12_4_ * 0.33333334);
  local_3b8 = vfmadd231ps_fma(auVar126,auVar107,auVar206);
  local_4e8._0_4_ = auVar194._0_4_;
  local_4e8._4_4_ = auVar194._4_4_;
  fStack_4e0 = auVar194._8_4_;
  fStack_4dc = auVar194._12_4_;
  auVar127._0_4_ = (float)local_4e8._0_4_ * 0.33333334;
  auVar127._4_4_ = (float)local_4e8._4_4_ * 0.33333334;
  auVar127._8_4_ = fStack_4e0 * 0.33333334;
  auVar127._12_4_ = fStack_4dc * 0.33333334;
  auVar18 = vsubps_avx(auVar158,auVar127);
  local_538._4_4_ = (float)local_558._4_4_ + (fVar288 + auVar73._4_4_) * 0.33333334;
  local_538._0_4_ = (float)local_558._0_4_ + (fVar275 + auVar73._0_4_) * 0.33333334;
  uStack_530._0_4_ = fStack_550 + (fVar289 + auVar73._8_4_) * 0.33333334;
  uStack_530._4_4_ = fStack_54c + (fVar290 + auVar73._12_4_) * 0.33333334;
  auVar266._0_4_ = (fVar291 + auVar149._0_4_) * 0.33333334;
  auVar266._4_4_ = (fVar302 + auVar149._4_4_) * 0.33333334;
  auVar266._8_4_ = (fVar303 + auVar149._8_4_) * 0.33333334;
  auVar266._12_4_ = (fVar304 + auVar149._12_4_) * 0.33333334;
  auVar19 = vsubps_avx(_local_518,auVar266);
  auVar281._0_4_ = auVar17._0_4_ * 0.33333334;
  auVar281._4_4_ = auVar17._4_4_ * 0.33333334;
  auVar281._8_4_ = auVar17._8_4_ * 0.33333334;
  auVar281._12_4_ = auVar17._12_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar16,auVar281);
  auVar240._0_4_ = (fVar233 + auVar106._0_4_) * 0.33333334;
  auVar240._4_4_ = (fVar93 + auVar106._4_4_) * 0.33333334;
  auVar240._8_4_ = (fVar218 + auVar106._8_4_) * 0.33333334;
  auVar240._12_4_ = (fVar219 + auVar106._12_4_) * 0.33333334;
  auVar169 = vsubps_avx(auVar171,auVar240);
  auVar282._0_4_ = fVar144 * auVar17._0_4_;
  auVar282._4_4_ = fVar144 * auVar17._4_4_;
  auVar282._8_4_ = fVar144 * auVar17._8_4_;
  auVar282._12_4_ = fVar144 * auVar17._12_4_;
  auVar222._0_4_ = fVar144 * auVar16._0_4_;
  auVar222._4_4_ = fVar144 * auVar16._4_4_;
  auVar222._8_4_ = fVar144 * auVar16._8_4_;
  auVar222._12_4_ = fVar144 * auVar16._12_4_;
  local_368 = vfmadd231ps_fma(auVar282,auVar107,auVar18);
  local_378 = vfmadd231ps_fma(auVar222,auVar107,auVar158);
  auVar128._0_4_ = fVar144 * fVar143;
  auVar128._4_4_ = fVar144 * fVar142;
  auVar128._8_4_ = fVar144 * fVar122;
  auVar128._12_4_ = fVar144 * fVar139;
  auVar151._0_4_ = fVar144 * (fVar143 + (fVar246 + auVar105._0_4_) * 0.33333334);
  auVar151._4_4_ = fVar144 * (fVar142 + (fVar260 + auVar105._4_4_) * 0.33333334);
  auVar151._8_4_ = fVar144 * (fVar122 + (fVar261 + auVar105._8_4_) * 0.33333334);
  auVar151._12_4_ = fVar144 * (fVar139 + (fVar262 + auVar105._12_4_) * 0.33333334);
  auVar190._0_4_ = fVar144 * auVar169._0_4_;
  auVar190._4_4_ = fVar144 * auVar169._4_4_;
  auVar190._8_4_ = fVar144 * auVar169._8_4_;
  auVar190._12_4_ = fVar144 * auVar169._12_4_;
  auVar172._0_4_ = fVar144 * auVar171._0_4_;
  auVar172._4_4_ = fVar144 * auVar171._4_4_;
  auVar172._8_4_ = fVar144 * auVar171._8_4_;
  auVar172._12_4_ = fVar144 * auVar171._12_4_;
  _local_388 = vfmadd231ps_fma(auVar128,auVar107,_local_558);
  _local_3c8 = vfmadd231ps_fma(auVar151,auVar107,_local_538);
  _local_3d8 = vfmadd231ps_fma(auVar190,auVar107,auVar19);
  _local_3e8 = vfmadd231ps_fma(auVar172,auVar107,_local_518);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar158 = vsubps_avx(local_358,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar158,auVar158,0x55);
  auVar17 = vshufps_avx(auVar158,auVar158,0xaa);
  aVar6 = (pre->ray_space).vy.field_0;
  fVar68 = (pre->ray_space).vz.field_0.m128[0];
  fVar94 = (pre->ray_space).vz.field_0.m128[1];
  fVar144 = (pre->ray_space).vz.field_0.m128[2];
  fVar143 = (pre->ray_space).vz.field_0.m128[3];
  auVar173._0_4_ = fVar68 * auVar17._0_4_;
  auVar173._4_4_ = fVar94 * auVar17._4_4_;
  auVar173._8_4_ = fVar144 * auVar17._8_4_;
  auVar173._12_4_ = fVar143 * auVar17._12_4_;
  auVar157 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar6,auVar16);
  auVar18 = vsubps_avx(local_3b8,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar18,auVar18,0x55);
  auVar17 = vshufps_avx(auVar18,auVar18,0xaa);
  auVar108._0_4_ = fVar68 * auVar17._0_4_;
  auVar108._4_4_ = fVar94 * auVar17._4_4_;
  auVar108._8_4_ = fVar144 * auVar17._8_4_;
  auVar108._12_4_ = fVar143 * auVar17._12_4_;
  auVar283 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar6,auVar16);
  auVar17 = vsubps_avx(local_368,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar129._0_4_ = fVar68 * auVar16._0_4_;
  auVar129._4_4_ = fVar94 * auVar16._4_4_;
  auVar129._8_4_ = fVar144 * auVar16._8_4_;
  auVar129._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar17,auVar17,0x55);
  auVar20 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar6,auVar16);
  auVar19 = vsubps_avx(local_378,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar152._0_4_ = fVar68 * auVar16._0_4_;
  auVar152._4_4_ = fVar94 * auVar16._4_4_;
  auVar152._8_4_ = fVar144 * auVar16._8_4_;
  auVar152._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar19,auVar19,0x55);
  auVar69 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar6,auVar16);
  auVar169 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar169,auVar169,0xaa);
  auVar191._0_4_ = fVar68 * auVar16._0_4_;
  auVar191._4_4_ = fVar94 * auVar16._4_4_;
  auVar191._8_4_ = fVar144 * auVar16._8_4_;
  auVar191._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar169,auVar169,0x55);
  auVar154 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar16);
  auVar15 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar250._0_4_ = fVar68 * auVar16._0_4_;
  auVar250._4_4_ = fVar94 * auVar16._4_4_;
  auVar250._8_4_ = fVar144 * auVar16._8_4_;
  auVar250._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar15,auVar15,0x55);
  auVar97 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar6,auVar16);
  auVar295 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar295,auVar295,0xaa);
  auVar294._0_4_ = fVar68 * auVar16._0_4_;
  auVar294._4_4_ = fVar94 * auVar16._4_4_;
  auVar294._8_4_ = fVar144 * auVar16._8_4_;
  auVar294._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar295,auVar295,0x55);
  auVar98 = vfmadd231ps_fma(auVar294,(undefined1  [16])aVar6,auVar16);
  auVar194 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
  auVar16 = vshufps_avx(auVar194,auVar194,0xaa);
  auVar223._0_4_ = fVar68 * auVar16._0_4_;
  auVar223._4_4_ = fVar94 * auVar16._4_4_;
  auVar223._8_4_ = fVar144 * auVar16._8_4_;
  auVar223._12_4_ = fVar143 * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar194,auVar194,0x55);
  auVar16 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar6,auVar16);
  local_538._0_4_ = auVar158._0_4_;
  auVar207._4_4_ = local_538._0_4_;
  auVar207._0_4_ = local_538._0_4_;
  auVar207._8_4_ = local_538._0_4_;
  auVar207._12_4_ = local_538._0_4_;
  aVar6 = (pre->ray_space).vx.field_0;
  auVar157 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar6,auVar207);
  local_558._0_4_ = auVar18._0_4_;
  auVar208._4_4_ = local_558._0_4_;
  auVar208._0_4_ = local_558._0_4_;
  auVar208._8_4_ = local_558._0_4_;
  auVar208._12_4_ = local_558._0_4_;
  auVar283 = vfmadd231ps_fma(auVar283,(undefined1  [16])aVar6,auVar208);
  uVar65 = auVar17._0_4_;
  auVar209._4_4_ = uVar65;
  auVar209._0_4_ = uVar65;
  auVar209._8_4_ = uVar65;
  auVar209._12_4_ = uVar65;
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar209);
  uVar65 = auVar19._0_4_;
  auVar210._4_4_ = uVar65;
  auVar210._0_4_ = uVar65;
  auVar210._8_4_ = uVar65;
  auVar210._12_4_ = uVar65;
  auVar69 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar6,auVar210);
  uVar65 = auVar169._0_4_;
  auVar211._4_4_ = uVar65;
  auVar211._0_4_ = uVar65;
  auVar211._8_4_ = uVar65;
  auVar211._12_4_ = uVar65;
  auVar169 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar6,auVar211);
  uVar65 = auVar15._0_4_;
  auVar212._4_4_ = uVar65;
  auVar212._0_4_ = uVar65;
  auVar212._8_4_ = uVar65;
  auVar212._12_4_ = uVar65;
  auVar15 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar6,auVar212);
  auVar75._0_4_ = auVar295._0_4_;
  auVar75._4_4_ = auVar75._0_4_;
  auVar75._8_4_ = auVar75._0_4_;
  auVar75._12_4_ = auVar75._0_4_;
  auVar295 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar6,auVar75);
  uVar65 = auVar194._0_4_;
  auVar76._4_4_ = uVar65;
  auVar76._0_4_ = uVar65;
  auVar76._8_4_ = uVar65;
  auVar76._12_4_ = uVar65;
  auVar194 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar76);
  _local_4e8 = vmovlhps_avx(auVar157,auVar169);
  auVar18 = vmovlhps_avx(auVar283,auVar15);
  auVar19 = vmovlhps_avx(auVar20,auVar295);
  _local_1f8 = vmovlhps_avx(auVar69,auVar194);
  auVar16 = vminps_avx(_local_4e8,auVar18);
  auVar17 = vminps_avx(auVar19,_local_1f8);
  auVar158 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(_local_4e8,auVar18);
  auVar17 = vmaxps_avx(auVar19,_local_1f8);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vshufpd_avx(auVar158,auVar158,3);
  auVar158 = vminps_avx(auVar158,auVar17);
  auVar17 = vshufpd_avx(auVar16,auVar16,3);
  auVar17 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vandps_avx(local_2b8,auVar158);
  auVar17 = vandps_avx(local_2b8,auVar17);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar17,auVar16);
  local_78 = auVar16._0_4_ * 9.536743e-07;
  local_468._0_8_ = auVar157._0_8_;
  local_468._8_8_ = local_468._0_8_;
  local_478._0_8_ = auVar283._0_8_;
  local_478._8_8_ = local_478._0_8_;
  local_488._8_8_ = auVar20._0_8_;
  local_488._0_8_ = auVar20._0_8_;
  local_498._8_8_ = auVar69._0_8_;
  local_498._0_8_ = auVar69._0_8_;
  register0x00001388 = auVar169._0_8_;
  local_4a8 = auVar169._0_8_;
  register0x000012c8 = auVar15._0_8_;
  local_4b8 = auVar15._0_8_;
  local_4c8 = auVar295._0_8_;
  register0x00001508 = local_4c8;
  register0x00001288 = auVar194._0_8_;
  local_4d8 = auVar194._0_8_;
  local_208 = ZEXT416((uint)local_78);
  local_2c8 = 0x80000000;
  uStack_2c4 = 0x80000000;
  uStack_2c0 = 0x80000000;
  uStack_2bc = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar59 = 0;
  local_338 = vsubps_avx(auVar18,_local_4e8);
  _local_348 = vsubps_avx(auVar19,auVar18);
  local_1e8 = vsubps_avx(_local_1f8,auVar19);
  local_228 = vsubps_avx(_local_388,local_358);
  local_238 = vsubps_avx(_local_3c8,local_3b8);
  local_248 = vsubps_avx(_local_3d8,local_368);
  _local_258 = vsubps_avx(_local_3e8,local_378);
  auVar77 = ZEXT816(0x3f80000000000000);
  local_218 = auVar77;
LAB_01235d63:
  auVar16 = vshufps_avx(auVar77,auVar77,0x50);
  auVar322._8_4_ = 0x3f800000;
  auVar322._0_8_ = 0x3f8000003f800000;
  auVar322._12_4_ = 0x3f800000;
  auVar325._16_4_ = 0x3f800000;
  auVar325._0_16_ = auVar322;
  auVar325._20_4_ = 0x3f800000;
  auVar325._24_4_ = 0x3f800000;
  auVar325._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar322,auVar16);
  fVar68 = auVar16._0_4_;
  auVar78._0_4_ = local_4a8._0_4_ * fVar68;
  fVar94 = auVar16._4_4_;
  auVar78._4_4_ = local_4a8._4_4_ * fVar94;
  fVar144 = auVar16._8_4_;
  auVar78._8_4_ = local_4a8._8_4_ * fVar144;
  fVar143 = auVar16._12_4_;
  auVar78._12_4_ = local_4a8._12_4_ * fVar143;
  auVar213._0_4_ = local_4b8._0_4_ * fVar68;
  auVar213._4_4_ = local_4b8._4_4_ * fVar94;
  auVar213._8_4_ = local_4b8._8_4_ * fVar144;
  auVar213._12_4_ = local_4b8._12_4_ * fVar143;
  auVar174._0_4_ = local_4c8._0_4_ * fVar68;
  auVar174._4_4_ = local_4c8._4_4_ * fVar94;
  auVar174._8_4_ = local_4c8._8_4_ * fVar144;
  auVar174._12_4_ = local_4c8._12_4_ * fVar143;
  auVar130._0_4_ = local_4d8._0_4_ * fVar68;
  auVar130._4_4_ = local_4d8._4_4_ * fVar94;
  auVar130._8_4_ = local_4d8._8_4_ * fVar144;
  auVar130._12_4_ = local_4d8._12_4_ * fVar143;
  auVar15 = vfmadd231ps_fma(auVar78,auVar17,local_468);
  auVar295 = vfmadd231ps_fma(auVar213,auVar17,local_478);
  auVar194 = vfmadd231ps_fma(auVar174,auVar17,local_488);
  auVar157 = vfmadd231ps_fma(auVar130,local_498,auVar17);
  auVar16 = vmovshdup_avx(local_218);
  fVar68 = local_218._0_4_;
  fStack_140 = (auVar16._0_4_ - fVar68) * 0.04761905;
  auVar258._4_4_ = fVar68;
  auVar258._0_4_ = fVar68;
  auVar258._8_4_ = fVar68;
  auVar258._12_4_ = fVar68;
  auVar258._16_4_ = fVar68;
  auVar258._20_4_ = fVar68;
  auVar258._24_4_ = fVar68;
  auVar258._28_4_ = fVar68;
  auVar119._0_8_ = auVar16._0_8_;
  auVar119._8_8_ = auVar119._0_8_;
  auVar119._16_8_ = auVar119._0_8_;
  auVar119._24_8_ = auVar119._0_8_;
  auVar118 = vsubps_avx(auVar119,auVar258);
  uVar65 = auVar15._0_4_;
  auVar320._4_4_ = uVar65;
  auVar320._0_4_ = uVar65;
  auVar320._8_4_ = uVar65;
  auVar320._12_4_ = uVar65;
  auVar320._16_4_ = uVar65;
  auVar320._20_4_ = uVar65;
  auVar320._24_4_ = uVar65;
  auVar320._28_4_ = uVar65;
  auVar16 = vmovshdup_avx(auVar15);
  uVar95 = auVar16._0_8_;
  auVar314._8_8_ = uVar95;
  auVar314._0_8_ = uVar95;
  auVar314._16_8_ = uVar95;
  auVar314._24_8_ = uVar95;
  fVar140 = auVar295._0_4_;
  auVar299._4_4_ = fVar140;
  auVar299._0_4_ = fVar140;
  auVar299._8_4_ = fVar140;
  auVar299._12_4_ = fVar140;
  auVar299._16_4_ = fVar140;
  auVar299._20_4_ = fVar140;
  auVar299._24_4_ = fVar140;
  auVar299._28_4_ = fVar140;
  auVar17 = vmovshdup_avx(auVar295);
  auVar120._0_8_ = auVar17._0_8_;
  auVar120._8_8_ = auVar120._0_8_;
  auVar120._16_8_ = auVar120._0_8_;
  auVar120._24_8_ = auVar120._0_8_;
  fVar139 = auVar194._0_4_;
  auVar230._4_4_ = fVar139;
  auVar230._0_4_ = fVar139;
  auVar230._8_4_ = fVar139;
  auVar230._12_4_ = fVar139;
  auVar230._16_4_ = fVar139;
  auVar230._20_4_ = fVar139;
  auVar230._24_4_ = fVar139;
  auVar230._28_4_ = fVar139;
  auVar158 = vmovshdup_avx(auVar194);
  auVar244._0_8_ = auVar158._0_8_;
  auVar244._8_8_ = auVar244._0_8_;
  auVar244._16_8_ = auVar244._0_8_;
  auVar244._24_8_ = auVar244._0_8_;
  fVar122 = auVar157._0_4_;
  auVar169 = vmovshdup_avx(auVar157);
  auVar283 = vfmadd132ps_fma(auVar118,auVar258,_DAT_01f7b040);
  auVar118 = vsubps_avx(auVar325,ZEXT1632(auVar283));
  fVar68 = auVar283._0_4_;
  fVar94 = auVar283._4_4_;
  auVar21._4_4_ = fVar140 * fVar94;
  auVar21._0_4_ = fVar140 * fVar68;
  fVar144 = auVar283._8_4_;
  auVar21._8_4_ = fVar140 * fVar144;
  fVar143 = auVar283._12_4_;
  auVar21._12_4_ = fVar140 * fVar143;
  auVar21._16_4_ = fVar140 * 0.0;
  auVar21._20_4_ = fVar140 * 0.0;
  auVar21._24_4_ = fVar140 * 0.0;
  auVar21._28_4_ = 0x3f800000;
  auVar283 = vfmadd231ps_fma(auVar21,auVar118,auVar320);
  fVar92 = auVar17._0_4_;
  fVar142 = auVar17._4_4_;
  auVar22._4_4_ = fVar142 * fVar94;
  auVar22._0_4_ = fVar92 * fVar68;
  auVar22._8_4_ = fVar92 * fVar144;
  auVar22._12_4_ = fVar142 * fVar143;
  auVar22._16_4_ = fVar92 * 0.0;
  auVar22._20_4_ = fVar142 * 0.0;
  auVar22._24_4_ = fVar92 * 0.0;
  auVar22._28_4_ = uVar65;
  auVar20 = vfmadd231ps_fma(auVar22,auVar118,auVar314);
  auVar23._4_4_ = fVar139 * fVar94;
  auVar23._0_4_ = fVar139 * fVar68;
  auVar23._8_4_ = fVar139 * fVar144;
  auVar23._12_4_ = fVar139 * fVar143;
  auVar23._16_4_ = fVar139 * 0.0;
  auVar23._20_4_ = fVar139 * 0.0;
  auVar23._24_4_ = fVar139 * 0.0;
  auVar23._28_4_ = auVar16._4_4_;
  auVar69 = vfmadd231ps_fma(auVar23,auVar118,auVar299);
  fVar92 = auVar158._0_4_;
  fVar142 = auVar158._4_4_;
  auVar14._4_4_ = fVar142 * fVar94;
  auVar14._0_4_ = fVar92 * fVar68;
  auVar14._8_4_ = fVar92 * fVar144;
  auVar14._12_4_ = fVar142 * fVar143;
  auVar14._16_4_ = fVar92 * 0.0;
  auVar14._20_4_ = fVar142 * 0.0;
  auVar14._24_4_ = fVar92 * 0.0;
  auVar14._28_4_ = fVar140;
  auVar154 = vfmadd231ps_fma(auVar14,auVar118,auVar120);
  auVar16 = vshufps_avx(auVar15,auVar15,0xaa);
  local_458._8_8_ = auVar16._0_8_;
  local_458._0_8_ = local_458._8_8_;
  local_458._16_8_ = local_458._8_8_;
  local_458._24_8_ = local_458._8_8_;
  auVar17 = vshufps_avx(auVar15,auVar15,0xff);
  uStack_530 = auVar17._0_8_;
  local_538 = (undefined1  [8])uStack_530;
  uStack_528 = uStack_530;
  uStack_520 = uStack_530;
  auVar24._4_4_ = fVar122 * fVar94;
  auVar24._0_4_ = fVar122 * fVar68;
  auVar24._8_4_ = fVar122 * fVar144;
  auVar24._12_4_ = fVar122 * fVar143;
  auVar24._16_4_ = fVar122 * 0.0;
  auVar24._20_4_ = fVar122 * 0.0;
  auVar24._24_4_ = fVar122 * 0.0;
  auVar24._28_4_ = fVar122;
  auVar15 = vfmadd231ps_fma(auVar24,auVar118,auVar230);
  auVar17 = vshufps_avx(auVar295,auVar295,0xaa);
  auVar231._0_8_ = auVar17._0_8_;
  auVar231._8_8_ = auVar231._0_8_;
  auVar231._16_8_ = auVar231._0_8_;
  auVar231._24_8_ = auVar231._0_8_;
  auVar158 = vshufps_avx(auVar295,auVar295,0xff);
  local_408._8_8_ = auVar158._0_8_;
  local_408._0_8_ = local_408._8_8_;
  local_408._16_8_ = local_408._8_8_;
  local_408._24_8_ = local_408._8_8_;
  fVar92 = auVar169._0_4_;
  fVar142 = auVar169._4_4_;
  auVar25._4_4_ = fVar142 * fVar94;
  auVar25._0_4_ = fVar92 * fVar68;
  auVar25._8_4_ = fVar92 * fVar144;
  auVar25._12_4_ = fVar142 * fVar143;
  auVar25._16_4_ = fVar92 * 0.0;
  auVar25._20_4_ = fVar142 * 0.0;
  auVar25._24_4_ = fVar92 * 0.0;
  auVar25._28_4_ = auVar16._4_4_;
  auVar97 = vfmadd231ps_fma(auVar25,auVar118,auVar244);
  auVar301._28_4_ = fVar142;
  auVar301._0_28_ =
       ZEXT1628(CONCAT412(auVar69._12_4_ * fVar143,
                          CONCAT48(auVar69._8_4_ * fVar144,
                                   CONCAT44(auVar69._4_4_ * fVar94,auVar69._0_4_ * fVar68))));
  auVar283 = vfmadd231ps_fma(auVar301,auVar118,ZEXT1632(auVar283));
  fVar92 = auVar158._4_4_;
  auVar27._28_4_ = fVar92;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar154._12_4_ * fVar143,
                          CONCAT48(auVar154._8_4_ * fVar144,
                                   CONCAT44(auVar154._4_4_ * fVar94,auVar154._0_4_ * fVar68))));
  auVar20 = vfmadd231ps_fma(auVar27,auVar118,ZEXT1632(auVar20));
  auVar16 = vshufps_avx(auVar194,auVar194,0xaa);
  uVar95 = auVar16._0_8_;
  auVar217._8_8_ = uVar95;
  auVar217._0_8_ = uVar95;
  auVar217._16_8_ = uVar95;
  auVar217._24_8_ = uVar95;
  auVar169 = vshufps_avx(auVar194,auVar194,0xff);
  uVar95 = auVar169._0_8_;
  auVar326._8_8_ = uVar95;
  auVar326._0_8_ = uVar95;
  auVar326._16_8_ = uVar95;
  auVar326._24_8_ = uVar95;
  auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar15._12_4_ * fVar143,
                                                CONCAT48(auVar15._8_4_ * fVar144,
                                                         CONCAT44(auVar15._4_4_ * fVar94,
                                                                  auVar15._0_4_ * fVar68)))),
                             auVar118,ZEXT1632(auVar69));
  auVar15 = vshufps_avx(auVar157,auVar157,0xaa);
  auVar295 = vshufps_avx(auVar157,auVar157,0xff);
  auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar97._12_4_,
                                                CONCAT48(fVar144 * auVar97._8_4_,
                                                         CONCAT44(fVar94 * auVar97._4_4_,
                                                                  fVar68 * auVar97._0_4_)))),
                             auVar118,ZEXT1632(auVar154));
  auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar194._12_4_,
                                               CONCAT48(fVar144 * auVar194._8_4_,
                                                        CONCAT44(fVar94 * auVar194._4_4_,
                                                                 fVar68 * auVar194._0_4_)))),
                            auVar118,ZEXT1632(auVar283));
  auVar21 = vsubps_avx(ZEXT1632(auVar194),ZEXT1632(auVar283));
  auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar157._12_4_,
                                                CONCAT48(fVar144 * auVar157._8_4_,
                                                         CONCAT44(fVar94 * auVar157._4_4_,
                                                                  fVar68 * auVar157._0_4_)))),
                             auVar118,ZEXT1632(auVar20));
  auVar22 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar20));
  fStack_30c = auVar22._28_4_;
  auVar300._0_4_ = fStack_140 * auVar21._0_4_ * 3.0;
  auVar300._4_4_ = fStack_140 * auVar21._4_4_ * 3.0;
  auVar300._8_4_ = fStack_140 * auVar21._8_4_ * 3.0;
  auVar300._12_4_ = fStack_140 * auVar21._12_4_ * 3.0;
  auVar300._16_4_ = fStack_140 * auVar21._16_4_ * 3.0;
  auVar300._20_4_ = fStack_140 * auVar21._20_4_ * 3.0;
  auVar300._24_4_ = fStack_140 * auVar21._24_4_ * 3.0;
  auVar300._28_4_ = 0;
  local_328._0_4_ = fStack_140 * auVar22._0_4_ * 3.0;
  local_328._4_4_ = fStack_140 * auVar22._4_4_ * 3.0;
  fStack_320 = fStack_140 * auVar22._8_4_ * 3.0;
  fStack_31c = fStack_140 * auVar22._12_4_ * 3.0;
  fStack_318 = fStack_140 * auVar22._16_4_ * 3.0;
  fStack_314 = fStack_140 * auVar22._20_4_ * 3.0;
  fStack_310 = fStack_140 * auVar22._24_4_ * 3.0;
  fVar142 = auVar17._0_4_;
  fVar122 = auVar17._4_4_;
  auVar28._4_4_ = fVar122 * fVar94;
  auVar28._0_4_ = fVar142 * fVar68;
  auVar28._8_4_ = fVar142 * fVar144;
  auVar28._12_4_ = fVar122 * fVar143;
  auVar28._16_4_ = fVar142 * 0.0;
  auVar28._20_4_ = fVar122 * 0.0;
  auVar28._24_4_ = fVar142 * 0.0;
  auVar28._28_4_ = fStack_30c;
  auVar17 = vfmadd231ps_fma(auVar28,auVar118,local_458);
  fVar142 = auVar158._0_4_;
  auVar29._4_4_ = fVar92 * fVar94;
  auVar29._0_4_ = fVar142 * fVar68;
  auVar29._8_4_ = fVar142 * fVar144;
  auVar29._12_4_ = fVar92 * fVar143;
  auVar29._16_4_ = fVar142 * 0.0;
  auVar29._20_4_ = fVar92 * 0.0;
  auVar29._24_4_ = fVar142 * 0.0;
  auVar29._28_4_ = 0;
  auVar158 = vfmadd231ps_fma(auVar29,auVar118,_local_538);
  fVar92 = auVar16._0_4_;
  fVar142 = auVar16._4_4_;
  auVar30._4_4_ = fVar142 * fVar94;
  auVar30._0_4_ = fVar92 * fVar68;
  auVar30._8_4_ = fVar92 * fVar144;
  auVar30._12_4_ = fVar142 * fVar143;
  auVar30._16_4_ = fVar92 * 0.0;
  auVar30._20_4_ = fVar142 * 0.0;
  auVar30._24_4_ = fVar92 * 0.0;
  auVar30._28_4_ = auVar21._28_4_;
  auVar16 = vfmadd231ps_fma(auVar30,auVar118,auVar231);
  fVar92 = auVar169._0_4_;
  fVar139 = auVar169._4_4_;
  auVar31._4_4_ = fVar139 * fVar94;
  auVar31._0_4_ = fVar92 * fVar68;
  auVar31._8_4_ = fVar92 * fVar144;
  auVar31._12_4_ = fVar139 * fVar143;
  auVar31._16_4_ = fVar92 * 0.0;
  auVar31._20_4_ = fVar139 * 0.0;
  auVar31._24_4_ = fVar92 * 0.0;
  auVar31._28_4_ = fVar122;
  auVar169 = vfmadd231ps_fma(auVar31,auVar118,local_408);
  local_408 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar69));
  fVar92 = auVar15._0_4_;
  fVar142 = auVar15._4_4_;
  auVar32._4_4_ = fVar142 * fVar94;
  auVar32._0_4_ = fVar92 * fVar68;
  auVar32._8_4_ = fVar92 * fVar144;
  auVar32._12_4_ = fVar142 * fVar143;
  auVar32._16_4_ = fVar92 * 0.0;
  auVar32._20_4_ = fVar142 * 0.0;
  auVar32._24_4_ = fVar92 * 0.0;
  auVar32._28_4_ = fVar142;
  auVar15 = vfmadd231ps_fma(auVar32,auVar118,auVar217);
  auVar24 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar194));
  fVar92 = auVar295._0_4_;
  fVar142 = auVar295._4_4_;
  auVar33._4_4_ = fVar142 * fVar94;
  auVar33._0_4_ = fVar92 * fVar68;
  auVar33._8_4_ = fVar92 * fVar144;
  auVar33._12_4_ = fVar142 * fVar143;
  auVar33._16_4_ = fVar92 * 0.0;
  auVar33._20_4_ = fVar142 * 0.0;
  auVar33._24_4_ = fVar92 * 0.0;
  auVar33._28_4_ = fVar142;
  auVar295 = vfmadd231ps_fma(auVar33,auVar118,auVar326);
  auVar34._28_4_ = fVar139;
  auVar34._0_28_ =
       ZEXT1628(CONCAT412(auVar16._12_4_ * fVar143,
                          CONCAT48(auVar16._8_4_ * fVar144,
                                   CONCAT44(auVar16._4_4_ * fVar94,auVar16._0_4_ * fVar68))));
  auVar17 = vfmadd231ps_fma(auVar34,auVar118,ZEXT1632(auVar17));
  auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar169._12_4_,
                                                CONCAT48(fVar144 * auVar169._8_4_,
                                                         CONCAT44(fVar94 * auVar169._4_4_,
                                                                  fVar68 * auVar169._0_4_)))),
                             auVar118,ZEXT1632(auVar158));
  local_458._0_4_ = auVar69._0_4_ + auVar300._0_4_;
  local_458._4_4_ = auVar69._4_4_ + auVar300._4_4_;
  local_458._8_4_ = auVar69._8_4_ + auVar300._8_4_;
  local_458._12_4_ = auVar69._12_4_ + auVar300._12_4_;
  local_458._16_4_ = auVar300._16_4_ + 0.0;
  local_458._20_4_ = auVar300._20_4_ + 0.0;
  local_458._24_4_ = auVar300._24_4_ + 0.0;
  local_458._28_4_ = 0;
  auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar15._12_4_ * fVar143,
                                               CONCAT48(auVar15._8_4_ * fVar144,
                                                        CONCAT44(auVar15._4_4_ * fVar94,
                                                                 auVar15._0_4_ * fVar68)))),auVar118
                            ,ZEXT1632(auVar16));
  auVar169 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar295._12_4_ * fVar143,
                                                CONCAT48(auVar295._8_4_ * fVar144,
                                                         CONCAT44(auVar295._4_4_ * fVar94,
                                                                  auVar295._0_4_ * fVar68)))),
                             auVar118,ZEXT1632(auVar169));
  auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar16._12_4_,
                                               CONCAT48(fVar144 * auVar16._8_4_,
                                                        CONCAT44(fVar94 * auVar16._4_4_,
                                                                 fVar68 * auVar16._0_4_)))),auVar118
                            ,ZEXT1632(auVar17));
  auVar295 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar169._12_4_ * fVar143,
                                                CONCAT48(auVar169._8_4_ * fVar144,
                                                         CONCAT44(auVar169._4_4_ * fVar94,
                                                                  auVar169._0_4_ * fVar68)))),
                             ZEXT1632(auVar158),auVar118);
  auVar118 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
  auVar21 = vsubps_avx(ZEXT1632(auVar169),ZEXT1632(auVar158));
  auVar321._0_4_ = fStack_140 * auVar118._0_4_ * 3.0;
  auVar321._4_4_ = fStack_140 * auVar118._4_4_ * 3.0;
  auVar321._8_4_ = fStack_140 * auVar118._8_4_ * 3.0;
  auVar321._12_4_ = fStack_140 * auVar118._12_4_ * 3.0;
  auVar321._16_4_ = fStack_140 * auVar118._16_4_ * 3.0;
  auVar321._20_4_ = fStack_140 * auVar118._20_4_ * 3.0;
  auVar321._24_4_ = fStack_140 * auVar118._24_4_ * 3.0;
  auVar321._28_4_ = 0;
  local_158 = fStack_140 * auVar21._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar21._4_4_ * 3.0;
  auVar35._4_4_ = fStack_154;
  auVar35._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar21._8_4_ * 3.0;
  auVar35._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar21._12_4_ * 3.0;
  auVar35._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar21._16_4_ * 3.0;
  auVar35._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar21._20_4_ * 3.0;
  auVar35._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar21._24_4_ * 3.0;
  auVar35._24_4_ = fStack_140;
  auVar35._28_4_ = 0x40400000;
  _local_428 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar15));
  _local_3a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar295));
  auVar118 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar69));
  auVar21 = vsubps_avx(ZEXT1632(auVar295),ZEXT1632(auVar194));
  auVar22 = vsubps_avx(_local_428,local_408);
  fVar140 = auVar118._0_4_ + auVar22._0_4_;
  fVar141 = auVar118._4_4_ + auVar22._4_4_;
  fVar164 = auVar118._8_4_ + auVar22._8_4_;
  fVar180 = auVar118._12_4_ + auVar22._12_4_;
  fVar181 = auVar118._16_4_ + auVar22._16_4_;
  fVar182 = auVar118._20_4_ + auVar22._20_4_;
  fVar233 = auVar118._24_4_ + auVar22._24_4_;
  auVar23 = vsubps_avx(_local_3a8,auVar24);
  auVar90._0_4_ = auVar21._0_4_ + auVar23._0_4_;
  auVar90._4_4_ = auVar21._4_4_ + auVar23._4_4_;
  auVar90._8_4_ = auVar21._8_4_ + auVar23._8_4_;
  auVar90._12_4_ = auVar21._12_4_ + auVar23._12_4_;
  auVar90._16_4_ = auVar21._16_4_ + auVar23._16_4_;
  auVar90._20_4_ = auVar21._20_4_ + auVar23._20_4_;
  auVar90._24_4_ = auVar21._24_4_ + auVar23._24_4_;
  auVar90._28_4_ = auVar21._28_4_ + auVar23._28_4_;
  local_f8 = ZEXT1632(auVar194);
  fVar68 = auVar194._0_4_;
  local_178 = (float)local_328._0_4_ + fVar68;
  fVar94 = auVar194._4_4_;
  fStack_174 = (float)local_328._4_4_ + fVar94;
  fVar144 = auVar194._8_4_;
  fStack_170 = fStack_320 + fVar144;
  fVar143 = auVar194._12_4_;
  fStack_16c = fStack_31c + fVar143;
  fStack_168 = fStack_318 + 0.0;
  fStack_164 = fStack_314 + 0.0;
  fStack_160 = fStack_310 + 0.0;
  local_b8 = ZEXT1632(auVar69);
  auVar21 = vsubps_avx(local_b8,auVar300);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar21);
  auVar21 = vsubps_avx(local_f8,_local_328);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar21);
  local_118._0_4_ = auVar15._0_4_ + auVar321._0_4_;
  local_118._4_4_ = auVar15._4_4_ + auVar321._4_4_;
  local_118._8_4_ = auVar15._8_4_ + auVar321._8_4_;
  local_118._12_4_ = auVar15._12_4_ + auVar321._12_4_;
  local_118._16_4_ = auVar321._16_4_ + 0.0;
  local_118._20_4_ = auVar321._20_4_ + 0.0;
  local_118._24_4_ = auVar321._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar301 = ZEXT1632(auVar15);
  auVar21 = vsubps_avx(auVar301,auVar321);
  auVar25 = vpermps_avx2(_DAT_01fb7720,auVar21);
  fVar92 = auVar295._0_4_;
  local_158 = fVar92 + local_158;
  fVar142 = auVar295._4_4_;
  fStack_154 = fVar142 + fStack_154;
  fVar122 = auVar295._8_4_;
  fStack_150 = fVar122 + fStack_150;
  fVar139 = auVar295._12_4_;
  fStack_14c = fVar139 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar21 = vsubps_avx(ZEXT1632(auVar295),auVar35);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar21);
  auVar36._4_4_ = fVar94 * fVar141;
  auVar36._0_4_ = fVar68 * fVar140;
  auVar36._8_4_ = fVar144 * fVar164;
  auVar36._12_4_ = fVar143 * fVar180;
  auVar36._16_4_ = fVar181 * 0.0;
  auVar36._20_4_ = fVar182 * 0.0;
  auVar36._24_4_ = fVar233 * 0.0;
  auVar36._28_4_ = auVar21._28_4_;
  auVar16 = vfnmadd231ps_fma(auVar36,local_b8,auVar90);
  fStack_15c = fStack_30c + 0.0;
  auVar37._4_4_ = fStack_174 * fVar141;
  auVar37._0_4_ = local_178 * fVar140;
  auVar37._8_4_ = fStack_170 * fVar164;
  auVar37._12_4_ = fStack_16c * fVar180;
  auVar37._16_4_ = fStack_168 * fVar181;
  auVar37._20_4_ = fStack_164 * fVar182;
  auVar37._24_4_ = fStack_160 * fVar233;
  auVar37._28_4_ = 0;
  auVar17 = vfnmadd231ps_fma(auVar37,auVar90,local_458);
  auVar38._4_4_ = local_198._4_4_ * fVar141;
  auVar38._0_4_ = local_198._0_4_ * fVar140;
  auVar38._8_4_ = local_198._8_4_ * fVar164;
  auVar38._12_4_ = local_198._12_4_ * fVar180;
  auVar38._16_4_ = local_198._16_4_ * fVar181;
  auVar38._20_4_ = local_198._20_4_ * fVar182;
  auVar38._24_4_ = local_198._24_4_ * fVar233;
  auVar38._28_4_ = fStack_30c + 0.0;
  auVar158 = vfnmadd231ps_fma(auVar38,local_d8,auVar90);
  local_538._0_4_ = auVar24._0_4_;
  local_538._4_4_ = auVar24._4_4_;
  uStack_530._0_4_ = auVar24._8_4_;
  uStack_530._4_4_ = auVar24._12_4_;
  uStack_528._0_4_ = auVar24._16_4_;
  uStack_528._4_4_ = auVar24._20_4_;
  uStack_520._0_4_ = auVar24._24_4_;
  uStack_520._4_4_ = auVar24._28_4_;
  auVar39._4_4_ = (float)local_538._4_4_ * fVar141;
  auVar39._0_4_ = (float)local_538._0_4_ * fVar140;
  auVar39._8_4_ = (float)uStack_530 * fVar164;
  auVar39._12_4_ = uStack_530._4_4_ * fVar180;
  auVar39._16_4_ = (float)uStack_528 * fVar181;
  auVar39._20_4_ = uStack_528._4_4_ * fVar182;
  auVar39._24_4_ = (float)uStack_520 * fVar233;
  auVar39._28_4_ = uStack_520._4_4_;
  auVar169 = vfnmadd231ps_fma(auVar39,local_408,auVar90);
  auVar245._0_4_ = fVar92 * fVar140;
  auVar245._4_4_ = fVar142 * fVar141;
  auVar245._8_4_ = fVar122 * fVar164;
  auVar245._12_4_ = fVar139 * fVar180;
  auVar245._16_4_ = fVar181 * 0.0;
  auVar245._20_4_ = fVar182 * 0.0;
  auVar245._24_4_ = fVar233 * 0.0;
  auVar245._28_4_ = 0;
  auVar15 = vfnmadd231ps_fma(auVar245,auVar301,auVar90);
  uStack_13c = 0x40400000;
  auVar40._4_4_ = fStack_154 * fVar141;
  auVar40._0_4_ = local_158 * fVar140;
  auVar40._8_4_ = fStack_150 * fVar164;
  auVar40._12_4_ = fStack_14c * fVar180;
  auVar40._16_4_ = fStack_148 * fVar181;
  auVar40._20_4_ = fStack_144 * fVar182;
  auVar40._24_4_ = fStack_140 * fVar233;
  auVar40._28_4_ = local_408._28_4_;
  auVar194 = vfnmadd231ps_fma(auVar40,local_118,auVar90);
  auVar41._4_4_ = local_138._4_4_ * fVar141;
  auVar41._0_4_ = local_138._0_4_ * fVar140;
  auVar41._8_4_ = local_138._8_4_ * fVar164;
  auVar41._12_4_ = local_138._12_4_ * fVar180;
  auVar41._16_4_ = local_138._16_4_ * fVar181;
  auVar41._20_4_ = local_138._20_4_ * fVar182;
  auVar41._24_4_ = local_138._24_4_ * fVar233;
  auVar41._28_4_ = local_138._28_4_;
  _local_328 = auVar25;
  auVar157 = vfnmadd231ps_fma(auVar41,auVar25,auVar90);
  auVar42._4_4_ = local_3a8._4_4_ * fVar141;
  auVar42._0_4_ = local_3a8._0_4_ * fVar140;
  auVar42._8_4_ = local_3a8._8_4_ * fVar164;
  auVar42._12_4_ = local_3a8._12_4_ * fVar180;
  auVar42._16_4_ = local_3a8._16_4_ * fVar181;
  auVar42._20_4_ = local_3a8._20_4_ * fVar182;
  auVar42._24_4_ = local_3a8._24_4_ * fVar233;
  auVar42._28_4_ = auVar118._28_4_ + auVar22._28_4_;
  auVar259 = ZEXT3264(_local_428);
  auVar283 = vfnmadd231ps_fma(auVar42,_local_428,auVar90);
  auVar21 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
  auVar118 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
  auVar22 = vminps_avx(ZEXT1632(auVar158),ZEXT1632(auVar169));
  auVar22 = vminps_avx(auVar21,auVar22);
  auVar21 = vmaxps_avx(ZEXT1632(auVar158),ZEXT1632(auVar169));
  auVar118 = vmaxps_avx(auVar118,auVar21);
  auVar23 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar194));
  auVar21 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar194));
  auVar14 = vminps_avx(ZEXT1632(auVar157),ZEXT1632(auVar283));
  auVar23 = vminps_avx(auVar23,auVar14);
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(ZEXT1632(auVar157),ZEXT1632(auVar283));
  auVar21 = vmaxps_avx(auVar21,auVar22);
  auVar21 = vmaxps_avx(auVar118,auVar21);
  auVar53._4_4_ = fStack_74;
  auVar53._0_4_ = local_78;
  auVar53._8_4_ = fStack_70;
  auVar53._12_4_ = fStack_6c;
  auVar53._16_4_ = fStack_68;
  auVar53._20_4_ = fStack_64;
  auVar53._24_4_ = fStack_60;
  auVar53._28_4_ = fStack_5c;
  auVar118 = vcmpps_avx(auVar23,auVar53,2);
  auVar52._4_4_ = fStack_94;
  auVar52._0_4_ = local_98;
  auVar52._8_4_ = fStack_90;
  auVar52._12_4_ = fStack_8c;
  auVar52._16_4_ = fStack_88;
  auVar52._20_4_ = fStack_84;
  auVar52._24_4_ = fStack_80;
  auVar52._28_4_ = fStack_7c;
  auVar21 = vcmpps_avx(auVar21,auVar52,5);
  auVar118 = vandps_avx(auVar21,auVar118);
  auVar21 = local_1b8 & auVar118;
  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0x7f,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar21 >> 0xbf,0) != '\0') ||
      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0') {
    auVar21 = vsubps_avx(local_408,local_b8);
    auVar22 = vsubps_avx(_local_428,auVar301);
    fVar141 = auVar21._0_4_ + auVar22._0_4_;
    fVar164 = auVar21._4_4_ + auVar22._4_4_;
    fVar180 = auVar21._8_4_ + auVar22._8_4_;
    fVar181 = auVar21._12_4_ + auVar22._12_4_;
    fVar182 = auVar21._16_4_ + auVar22._16_4_;
    fVar233 = auVar21._20_4_ + auVar22._20_4_;
    fVar93 = auVar21._24_4_ + auVar22._24_4_;
    auVar23 = vsubps_avx(auVar24,local_f8);
    auVar14 = vsubps_avx(_local_3a8,ZEXT1632(auVar295));
    auVar121._0_4_ = auVar23._0_4_ + auVar14._0_4_;
    auVar121._4_4_ = auVar23._4_4_ + auVar14._4_4_;
    auVar121._8_4_ = auVar23._8_4_ + auVar14._8_4_;
    auVar121._12_4_ = auVar23._12_4_ + auVar14._12_4_;
    auVar121._16_4_ = auVar23._16_4_ + auVar14._16_4_;
    auVar121._20_4_ = auVar23._20_4_ + auVar14._20_4_;
    auVar121._24_4_ = auVar23._24_4_ + auVar14._24_4_;
    fVar140 = auVar14._28_4_;
    auVar121._28_4_ = auVar23._28_4_ + fVar140;
    auVar43._4_4_ = fVar94 * fVar164;
    auVar43._0_4_ = fVar68 * fVar141;
    auVar43._8_4_ = fVar144 * fVar180;
    auVar43._12_4_ = fVar143 * fVar181;
    auVar43._16_4_ = fVar182 * 0.0;
    auVar43._20_4_ = fVar233 * 0.0;
    auVar43._24_4_ = fVar93 * 0.0;
    auVar43._28_4_ = local_3a8._28_4_;
    auVar15 = vfnmadd231ps_fma(auVar43,auVar121,local_b8);
    auVar44._4_4_ = fVar164 * fStack_174;
    auVar44._0_4_ = fVar141 * local_178;
    auVar44._8_4_ = fVar180 * fStack_170;
    auVar44._12_4_ = fVar181 * fStack_16c;
    auVar44._16_4_ = fVar182 * fStack_168;
    auVar44._20_4_ = fVar233 * fStack_164;
    auVar44._24_4_ = fVar93 * fStack_160;
    auVar44._28_4_ = 0;
    auVar16 = vfnmadd213ps_fma(local_458,auVar121,auVar44);
    auVar45._4_4_ = fVar164 * local_198._4_4_;
    auVar45._0_4_ = fVar141 * local_198._0_4_;
    auVar45._8_4_ = fVar180 * local_198._8_4_;
    auVar45._12_4_ = fVar181 * local_198._12_4_;
    auVar45._16_4_ = fVar182 * local_198._16_4_;
    auVar45._20_4_ = fVar233 * local_198._20_4_;
    auVar45._24_4_ = fVar93 * local_198._24_4_;
    auVar45._28_4_ = 0;
    auVar17 = vfnmadd213ps_fma(local_d8,auVar121,auVar45);
    auVar46._4_4_ = (float)local_538._4_4_ * fVar164;
    auVar46._0_4_ = (float)local_538._0_4_ * fVar141;
    auVar46._8_4_ = (float)uStack_530 * fVar180;
    auVar46._12_4_ = uStack_530._4_4_ * fVar181;
    auVar46._16_4_ = (float)uStack_528 * fVar182;
    auVar46._20_4_ = uStack_528._4_4_ * fVar233;
    auVar46._24_4_ = (float)uStack_520 * fVar93;
    auVar46._28_4_ = 0;
    auVar295 = vfnmadd231ps_fma(auVar46,auVar121,local_408);
    auVar162._0_4_ = fVar92 * fVar141;
    auVar162._4_4_ = fVar142 * fVar164;
    auVar162._8_4_ = fVar122 * fVar180;
    auVar162._12_4_ = fVar139 * fVar181;
    auVar162._16_4_ = fVar182 * 0.0;
    auVar162._20_4_ = fVar233 * 0.0;
    auVar162._24_4_ = fVar93 * 0.0;
    auVar162._28_4_ = 0;
    auVar194 = vfnmadd231ps_fma(auVar162,auVar121,auVar301);
    auVar47._4_4_ = fVar164 * fStack_154;
    auVar47._0_4_ = fVar141 * local_158;
    auVar47._8_4_ = fVar180 * fStack_150;
    auVar47._12_4_ = fVar181 * fStack_14c;
    auVar47._16_4_ = fVar182 * fStack_148;
    auVar47._20_4_ = fVar233 * fStack_144;
    auVar47._24_4_ = fVar93 * fStack_140;
    auVar47._28_4_ = fVar140;
    auVar158 = vfnmadd213ps_fma(local_118,auVar121,auVar47);
    auVar48._4_4_ = fVar164 * local_138._4_4_;
    auVar48._0_4_ = fVar141 * local_138._0_4_;
    auVar48._8_4_ = fVar180 * local_138._8_4_;
    auVar48._12_4_ = fVar181 * local_138._12_4_;
    auVar48._16_4_ = fVar182 * local_138._16_4_;
    auVar48._20_4_ = fVar233 * local_138._20_4_;
    auVar48._24_4_ = fVar93 * local_138._24_4_;
    auVar48._28_4_ = fVar140;
    auVar169 = vfnmadd213ps_fma(auVar25,auVar121,auVar48);
    auVar259 = ZEXT1664(auVar169);
    auVar49._4_4_ = fVar164 * local_3a8._4_4_;
    auVar49._0_4_ = fVar141 * local_3a8._0_4_;
    auVar49._8_4_ = fVar180 * local_3a8._8_4_;
    auVar49._12_4_ = fVar181 * local_3a8._12_4_;
    auVar49._16_4_ = fVar182 * local_3a8._16_4_;
    auVar49._20_4_ = fVar233 * local_3a8._20_4_;
    auVar49._24_4_ = fVar93 * local_3a8._24_4_;
    auVar49._28_4_ = auVar21._28_4_ + auVar22._28_4_;
    auVar157 = vfnmadd231ps_fma(auVar49,auVar121,_local_428);
    auVar22 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar21 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar23 = vminps_avx(ZEXT1632(auVar17),ZEXT1632(auVar295));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar295));
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar14 = vminps_avx(ZEXT1632(auVar194),ZEXT1632(auVar158));
    auVar22 = vmaxps_avx(ZEXT1632(auVar194),ZEXT1632(auVar158));
    auVar24 = vminps_avx(ZEXT1632(auVar169),ZEXT1632(auVar157));
    auVar14 = vminps_avx(auVar14,auVar24);
    auVar14 = vminps_avx(auVar23,auVar14);
    auVar23 = vmaxps_avx(ZEXT1632(auVar169),ZEXT1632(auVar157));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vcmpps_avx(auVar14,auVar53,2);
    auVar22 = vcmpps_avx(auVar22,auVar52,5);
    auVar21 = vandps_avx(auVar22,auVar21);
    auVar118 = vandps_avx(auVar118,local_1b8);
    auVar22 = auVar118 & auVar21;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar118 = vandps_avx(auVar21,auVar118);
      uVar64 = vmovmskps_avx(auVar118);
      if (uVar64 != 0) {
        auStack_2a8[uVar59] = uVar64 & 0xff;
        uVar95 = vmovlps_avx(local_218);
        *(undefined8 *)(&uStack_1d8 + uVar59 * 2) = uVar95;
        uVar63 = vmovlps_avx(auVar77);
        auStack_58[uVar59] = uVar63;
        uVar59 = (ulong)((int)uVar59 + 1);
      }
    }
  }
LAB_01236312:
  if ((int)uVar59 == 0) {
    fVar68 = (ray->super_RayK<1>).tfar;
    auVar89._4_4_ = fVar68;
    auVar89._0_4_ = fVar68;
    auVar89._8_4_ = fVar68;
    auVar89._12_4_ = fVar68;
    auVar16 = vcmpps_avx(local_268,auVar89,2);
    uVar57 = vmovmskps_avx(auVar16);
    uVar58 = (ulong)((uint)uVar58 & (uint)uVar58 + 0xf & uVar57);
    goto LAB_012350e7;
  }
  uVar56 = (int)uVar59 - 1;
  uVar60 = (ulong)uVar56;
  uVar62 = auStack_2a8[uVar60];
  uVar64 = (&uStack_1d8)[uVar60 * 2];
  fVar68 = afStack_1d4[uVar60 * 2];
  iVar26 = 0;
  for (uVar63 = (ulong)uVar62; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    iVar26 = iVar26 + 1;
  }
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 == 0) {
    uVar59 = (ulong)uVar56;
  }
  auVar77._8_8_ = 0;
  auVar77._0_8_ = auStack_58[uVar60];
  auStack_2a8[uVar60] = uVar62;
  fVar94 = (float)(iVar26 + 1) * 0.14285715;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * (float)iVar26 * 0.14285715)),ZEXT416(uVar64),
                            ZEXT416((uint)(1.0 - (float)iVar26 * 0.14285715)));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar94)),ZEXT416(uVar64),
                            ZEXT416((uint)(1.0 - fVar94)));
  fVar94 = auVar17._0_4_;
  auVar232._0_4_ = auVar16._0_4_;
  fVar68 = fVar94 - auVar232._0_4_;
  if (fVar68 < 0.16666667) {
    auVar158 = vshufps_avx(auVar77,auVar77,0x50);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar169 = vsubps_avx(auVar109,auVar158);
    fVar144 = auVar158._0_4_;
    auVar175._0_4_ = fVar144 * (float)local_4a8._0_4_;
    fVar143 = auVar158._4_4_;
    auVar175._4_4_ = fVar143 * (float)local_4a8._4_4_;
    fVar92 = auVar158._8_4_;
    auVar175._8_4_ = fVar92 * fStack_4a0;
    fVar142 = auVar158._12_4_;
    auVar175._12_4_ = fVar142 * fStack_49c;
    auVar192._0_4_ = fVar144 * (float)local_4b8._0_4_;
    auVar192._4_4_ = fVar143 * (float)local_4b8._4_4_;
    auVar192._8_4_ = fVar92 * fStack_4b0;
    auVar192._12_4_ = fVar142 * fStack_4ac;
    auVar214._0_4_ = fVar144 * (float)local_4c8._0_4_;
    auVar214._4_4_ = fVar143 * (float)local_4c8._4_4_;
    auVar214._8_4_ = fVar92 * fStack_4c0;
    auVar214._12_4_ = fVar142 * fStack_4bc;
    auVar79._0_4_ = fVar144 * (float)local_4d8._0_4_;
    auVar79._4_4_ = fVar143 * (float)local_4d8._4_4_;
    auVar79._8_4_ = fVar92 * fStack_4d0;
    auVar79._12_4_ = fVar142 * fStack_4cc;
    auVar158 = vfmadd231ps_fma(auVar175,auVar169,local_468);
    auVar15 = vfmadd231ps_fma(auVar192,auVar169,local_478);
    auVar295 = vfmadd231ps_fma(auVar214,auVar169,local_488);
    auVar169 = vfmadd231ps_fma(auVar79,auVar169,local_498);
    auVar163._16_16_ = auVar158;
    auVar163._0_16_ = auVar158;
    auVar179._16_16_ = auVar15;
    auVar179._0_16_ = auVar15;
    auVar202._16_16_ = auVar295;
    auVar202._0_16_ = auVar295;
    auVar232._4_4_ = auVar232._0_4_;
    auVar232._8_4_ = auVar232._0_4_;
    auVar232._12_4_ = auVar232._0_4_;
    auVar232._20_4_ = fVar94;
    auVar232._16_4_ = fVar94;
    auVar232._24_4_ = fVar94;
    auVar232._28_4_ = fVar94;
    auVar118 = vsubps_avx(auVar179,auVar163);
    auVar15 = vfmadd213ps_fma(auVar118,auVar232,auVar163);
    auVar118 = vsubps_avx(auVar202,auVar179);
    auVar194 = vfmadd213ps_fma(auVar118,auVar232,auVar179);
    auVar158 = vsubps_avx(auVar169,auVar295);
    auVar91._16_16_ = auVar158;
    auVar91._0_16_ = auVar158;
    auVar158 = vfmadd213ps_fma(auVar91,auVar232,auVar202);
    auVar118 = vsubps_avx(ZEXT1632(auVar194),ZEXT1632(auVar15));
    auVar169 = vfmadd213ps_fma(auVar118,auVar232,ZEXT1632(auVar15));
    auVar118 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar194));
    auVar158 = vfmadd213ps_fma(auVar118,auVar232,ZEXT1632(auVar194));
    auVar118 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar169));
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar118,auVar232);
    fVar139 = auVar118._4_4_ * 3.0;
    local_408._0_4_ = fVar68;
    fVar144 = fVar68 * 0.33333334;
    auVar224._0_8_ =
         CONCAT44(auVar20._4_4_ + fVar144 * fVar139,auVar20._0_4_ + fVar144 * auVar118._0_4_ * 3.0);
    auVar224._8_4_ = auVar20._8_4_ + fVar144 * auVar118._8_4_ * 3.0;
    auVar224._12_4_ = auVar20._12_4_ + fVar144 * auVar118._12_4_ * 3.0;
    auVar169 = vshufpd_avx(auVar20,auVar20,3);
    auVar15 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_3a8 = auVar169;
    auVar158 = vsubps_avx(auVar169,auVar20);
    _local_428 = auVar15;
    auVar295 = vsubps_avx(auVar15,(undefined1  [16])0x0);
    auVar80._0_4_ = auVar158._0_4_ + auVar295._0_4_;
    auVar80._4_4_ = auVar158._4_4_ + auVar295._4_4_;
    auVar80._8_4_ = auVar158._8_4_ + auVar295._8_4_;
    auVar80._12_4_ = auVar158._12_4_ + auVar295._12_4_;
    auVar158 = vshufps_avx(auVar20,auVar20,0xb1);
    auVar295 = vshufps_avx(auVar224,auVar224,0xb1);
    auVar317._4_4_ = auVar80._0_4_;
    auVar317._0_4_ = auVar80._0_4_;
    auVar317._8_4_ = auVar80._0_4_;
    auVar317._12_4_ = auVar80._0_4_;
    auVar194 = vshufps_avx(auVar80,auVar80,0x55);
    fVar143 = auVar194._0_4_;
    auVar81._0_4_ = fVar143 * auVar158._0_4_;
    fVar92 = auVar194._4_4_;
    auVar81._4_4_ = fVar92 * auVar158._4_4_;
    fVar142 = auVar194._8_4_;
    auVar81._8_4_ = fVar142 * auVar158._8_4_;
    fVar122 = auVar194._12_4_;
    auVar81._12_4_ = fVar122 * auVar158._12_4_;
    auVar193._0_4_ = fVar143 * auVar295._0_4_;
    auVar193._4_4_ = fVar92 * auVar295._4_4_;
    auVar193._8_4_ = fVar142 * auVar295._8_4_;
    auVar193._12_4_ = fVar122 * auVar295._12_4_;
    auVar157 = vfmadd231ps_fma(auVar81,auVar317,auVar20);
    _local_328 = auVar224;
    auVar283 = vfmadd231ps_fma(auVar193,auVar317,auVar224);
    auVar295 = vshufps_avx(auVar157,auVar157,0xe8);
    auVar194 = vshufps_avx(auVar283,auVar283,0xe8);
    auVar158 = vcmpps_avx(auVar295,auVar194,1);
    uVar64 = vextractps_avx(auVar158,0);
    auVar69 = auVar283;
    if ((uVar64 & 1) == 0) {
      auVar69 = auVar157;
    }
    local_458._0_16_ = auVar17;
    auVar153._0_4_ = fVar144 * auVar118._16_4_ * 3.0;
    auVar153._4_4_ = fVar144 * fVar139;
    auVar153._8_4_ = fVar144 * auVar118._24_4_ * 3.0;
    auVar153._12_4_ = fVar144 * auVar259._28_4_;
    auVar123 = vsubps_avx((undefined1  [16])0x0,auVar153);
    auVar154 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar97 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar225._0_4_ = fVar143 * auVar154._0_4_;
    auVar225._4_4_ = fVar92 * auVar154._4_4_;
    auVar225._8_4_ = fVar142 * auVar154._8_4_;
    auVar225._12_4_ = fVar122 * auVar154._12_4_;
    auVar241._0_4_ = auVar97._0_4_ * fVar143;
    auVar241._4_4_ = auVar97._4_4_ * fVar92;
    auVar241._8_4_ = auVar97._8_4_ * fVar142;
    auVar241._12_4_ = auVar97._12_4_ * fVar122;
    auVar124 = vfmadd231ps_fma(auVar225,auVar317,auVar123);
    auVar96 = vfmadd231ps_fma(auVar241,(undefined1  [16])0x0,auVar317);
    auVar97 = vshufps_avx(auVar124,auVar124,0xe8);
    auVar98 = vshufps_avx(auVar96,auVar96,0xe8);
    auVar259 = ZEXT1664(auVar98);
    auVar154 = vcmpps_avx(auVar97,auVar98,1);
    uVar64 = vextractps_avx(auVar154,0);
    auVar145 = auVar96;
    if ((uVar64 & 1) == 0) {
      auVar145 = auVar124;
    }
    auVar69 = vmaxss_avx(auVar145,auVar69);
    auVar295 = vminps_avx(auVar295,auVar194);
    auVar194 = vminps_avx(auVar97,auVar98);
    auVar194 = vminps_avx(auVar295,auVar194);
    auVar158 = vshufps_avx(auVar158,auVar158,0x55);
    auVar158 = vblendps_avx(auVar158,auVar154,2);
    auVar154 = vpslld_avx(auVar158,0x1f);
    auVar158 = vshufpd_avx(auVar283,auVar283,1);
    auVar158 = vinsertps_avx(auVar158,auVar96,0x9c);
    auVar295 = vshufpd_avx(auVar157,auVar157,1);
    auVar295 = vinsertps_avx(auVar295,auVar124,0x9c);
    auVar158 = vblendvps_avx(auVar295,auVar158,auVar154);
    auVar295 = vmovshdup_avx(auVar158);
    auVar158 = vmaxss_avx(auVar295,auVar158);
    fVar142 = auVar194._0_4_;
    auVar295 = vmovshdup_avx(auVar194);
    fVar92 = auVar158._0_4_;
    fVar144 = auVar295._0_4_;
    fVar143 = auVar69._0_4_;
    if (((0.0001 <= fVar142) || (fVar92 <= -0.0001)) && (0.0001 <= fVar144 || fVar92 <= -0.0001))
    goto code_r0x0123661c;
    goto LAB_01236642;
  }
  local_218 = vinsertps_avx(auVar16,auVar17,0x10);
  goto LAB_01235d63;
code_r0x0123661c:
  auVar295 = vcmpps_avx(auVar295,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar157 = vcmpps_avx(auVar194,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar295 = vandps_avx(auVar157,auVar295);
  if (fVar143 <= -0.0001 || (auVar295 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01236312;
LAB_01236642:
  auVar157 = vcmpps_avx(auVar194,_DAT_01f45a50,1);
  auVar283 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar295 = vcmpss_avx(auVar69,ZEXT816(0) << 0x20,1);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar131._8_4_ = 0xbf800000;
  auVar131._0_8_ = 0xbf800000bf800000;
  auVar131._12_4_ = 0xbf800000;
  auVar295 = vblendvps_avx(auVar110,auVar131,auVar295);
  auVar157 = vblendvps_avx(auVar110,auVar131,auVar157);
  fVar139 = auVar157._0_4_;
  fVar122 = auVar295._0_4_;
  auVar295 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar139 == fVar122) && (!NAN(fVar139) && !NAN(fVar122))) {
    auVar295 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar139 == fVar122) && (!NAN(fVar139) && !NAN(fVar122))) {
    auVar283 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar157 = vmovshdup_avx(auVar157);
  fVar140 = auVar157._0_4_;
  if ((fVar139 != fVar140) || (NAN(fVar139) || NAN(fVar140))) {
    if ((fVar144 != fVar142) || (NAN(fVar144) || NAN(fVar142))) {
      auVar155._0_4_ = (float)((uint)fVar142 ^ local_2c8);
      auVar155._4_4_ = auVar194._4_4_ ^ uStack_2c4;
      auVar155._8_4_ = auVar194._8_4_ ^ uStack_2c0;
      auVar155._12_4_ = auVar194._12_4_ ^ uStack_2bc;
      auVar156._0_4_ = auVar155._0_4_ / (fVar144 - fVar142);
      auVar156._4_12_ = auVar155._4_12_;
      auVar194 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
      auVar157 = auVar194;
    }
    else {
      auVar194 = ZEXT816(0) << 0x20;
      if ((fVar142 != 0.0) || (auVar157 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar142))) {
        auVar194 = SUB6416(ZEXT464(0x7f800000),0);
        auVar157 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar295 = vminss_avx(auVar295,auVar194);
    auVar283 = vmaxss_avx(auVar157,auVar283);
  }
  auVar158 = vcmpss_avx(auVar158,ZEXT416(0),1);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar132._8_4_ = 0xbf800000;
  auVar132._0_8_ = 0xbf800000bf800000;
  auVar132._12_4_ = 0xbf800000;
  auVar158 = vblendvps_avx(auVar111,auVar132,auVar158);
  fVar144 = auVar158._0_4_;
  if ((fVar122 != fVar144) || (NAN(fVar122) || NAN(fVar144))) {
    if ((fVar92 != fVar143) || (NAN(fVar92) || NAN(fVar143))) {
      auVar82._0_4_ = (float)((uint)fVar143 ^ local_2c8);
      auVar82._4_4_ = auVar69._4_4_ ^ uStack_2c4;
      auVar82._8_4_ = auVar69._8_4_ ^ uStack_2c0;
      auVar82._12_4_ = auVar69._12_4_ ^ uStack_2bc;
      auVar159._0_4_ = auVar82._0_4_ / (fVar92 - fVar143);
      auVar159._4_12_ = auVar82._4_12_;
      auVar158 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar159._0_4_)),auVar159,ZEXT416(0));
      auVar194 = auVar158;
    }
    else {
      auVar158 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar143 != 0.0) || (auVar194 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar143))) {
        auVar158 = SUB6416(ZEXT464(0xff800000),0);
        auVar194 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar295 = vminss_avx(auVar295,auVar194);
    auVar283 = vmaxss_avx(auVar158,auVar283);
  }
  if ((fVar140 != fVar144) || (NAN(fVar140) || NAN(fVar144))) {
    auVar295 = vminss_avx(auVar295,SUB6416(ZEXT464(0x3f800000),0));
    auVar283 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar283);
  }
  auVar158 = vmaxss_avx(ZEXT816(0) << 0x40,auVar295);
  auVar295 = vminss_avx(auVar283,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar295._0_4_ < auVar158._0_4_) goto LAB_01236312;
  auVar158 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar158._0_4_ + -0.1)));
  auVar295 = vminss_avx(ZEXT416((uint)(auVar295._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar176._0_8_ = auVar20._0_8_;
  auVar176._8_8_ = auVar176._0_8_;
  auVar251._8_8_ = auVar224._0_8_;
  auVar251._0_8_ = auVar224._0_8_;
  auVar267._8_8_ = auVar123._0_8_;
  auVar267._0_8_ = auVar123._0_8_;
  auVar194 = vshufpd_avx(auVar224,auVar224,3);
  auVar157 = vshufpd_avx(auVar123,auVar123,3);
  auVar283 = vshufps_avx(auVar158,auVar295,0);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = 0x3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar83,auVar283);
  local_3a8._0_4_ = auVar169._0_4_;
  local_3a8._4_4_ = auVar169._4_4_;
  fStack_3a0 = auVar169._8_4_;
  fStack_39c = auVar169._12_4_;
  fVar144 = auVar283._0_4_;
  auVar84._0_4_ = fVar144 * (float)local_3a8._0_4_;
  fVar143 = auVar283._4_4_;
  auVar84._4_4_ = fVar143 * (float)local_3a8._4_4_;
  fVar92 = auVar283._8_4_;
  auVar84._8_4_ = fVar92 * fStack_3a0;
  fVar142 = auVar283._12_4_;
  auVar84._12_4_ = fVar142 * fStack_39c;
  auVar215._0_4_ = fVar144 * auVar194._0_4_;
  auVar215._4_4_ = fVar143 * auVar194._4_4_;
  auVar215._8_4_ = fVar92 * auVar194._8_4_;
  auVar215._12_4_ = fVar142 * auVar194._12_4_;
  auVar226._0_4_ = fVar144 * auVar157._0_4_;
  auVar226._4_4_ = fVar143 * auVar157._4_4_;
  auVar226._8_4_ = fVar92 * auVar157._8_4_;
  auVar226._12_4_ = fVar142 * auVar157._12_4_;
  local_428._0_4_ = auVar15._0_4_;
  local_428._4_4_ = auVar15._4_4_;
  fStack_420 = auVar15._8_4_;
  fStack_41c = auVar15._12_4_;
  auVar242._0_4_ = fVar144 * (float)local_428._0_4_;
  auVar242._4_4_ = fVar143 * (float)local_428._4_4_;
  auVar242._8_4_ = fVar92 * fStack_420;
  auVar242._12_4_ = fVar142 * fStack_41c;
  auVar194 = vfmadd231ps_fma(auVar84,auVar20,auVar176);
  auVar157 = vfmadd231ps_fma(auVar215,auVar20,auVar251);
  auVar283 = vfmadd231ps_fma(auVar226,auVar20,auVar267);
  auVar20 = vfmadd231ps_fma(auVar242,auVar20,ZEXT816(0));
  auVar169 = vmovshdup_avx(auVar77);
  auVar123 = vfmadd231ss_fma(ZEXT416((uint)(auVar169._0_4_ * auVar158._0_4_)),auVar77,
                             ZEXT416((uint)(1.0 - auVar158._0_4_)));
  auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar169._0_4_ * auVar295._0_4_)),auVar77,
                             ZEXT416((uint)(1.0 - auVar295._0_4_)));
  fVar144 = 1.0 / fVar68;
  auVar158 = vsubps_avx(auVar157,auVar194);
  auVar252._0_4_ = auVar158._0_4_ * 3.0;
  auVar252._4_4_ = auVar158._4_4_ * 3.0;
  auVar252._8_4_ = auVar158._8_4_ * 3.0;
  auVar252._12_4_ = auVar158._12_4_ * 3.0;
  auVar158 = vsubps_avx(auVar283,auVar157);
  auVar268._0_4_ = auVar158._0_4_ * 3.0;
  auVar268._4_4_ = auVar158._4_4_ * 3.0;
  auVar268._8_4_ = auVar158._8_4_ * 3.0;
  auVar268._12_4_ = auVar158._12_4_ * 3.0;
  auVar158 = vsubps_avx(auVar20,auVar283);
  auVar284._0_4_ = auVar158._0_4_ * 3.0;
  auVar284._4_4_ = auVar158._4_4_ * 3.0;
  auVar284._8_4_ = auVar158._8_4_ * 3.0;
  auVar284._12_4_ = auVar158._12_4_ * 3.0;
  auVar169 = vminps_avx(auVar268,auVar284);
  auVar158 = vmaxps_avx(auVar268,auVar284);
  auVar169 = vminps_avx(auVar252,auVar169);
  auVar158 = vmaxps_avx(auVar252,auVar158);
  auVar15 = vshufpd_avx(auVar169,auVar169,3);
  auVar295 = vshufpd_avx(auVar158,auVar158,3);
  auVar169 = vminps_avx(auVar169,auVar15);
  auVar158 = vmaxps_avx(auVar158,auVar295);
  auVar269._0_4_ = auVar169._0_4_ * fVar144;
  auVar269._4_4_ = auVar169._4_4_ * fVar144;
  auVar269._8_4_ = auVar169._8_4_ * fVar144;
  auVar269._12_4_ = auVar169._12_4_ * fVar144;
  auVar253._0_4_ = auVar158._0_4_ * fVar144;
  auVar253._4_4_ = auVar158._4_4_ * fVar144;
  auVar253._8_4_ = auVar158._8_4_ * fVar144;
  auVar253._12_4_ = auVar158._12_4_ * fVar144;
  fVar144 = 1.0 / (auVar124._0_4_ - auVar123._0_4_);
  auVar158 = vshufpd_avx(auVar194,auVar194,3);
  auVar169 = vshufpd_avx(auVar157,auVar157,3);
  auVar15 = vshufpd_avx(auVar283,auVar283,3);
  auVar295 = vshufpd_avx(auVar20,auVar20,3);
  auVar158 = vsubps_avx(auVar158,auVar194);
  auVar194 = vsubps_avx(auVar169,auVar157);
  auVar157 = vsubps_avx(auVar15,auVar283);
  auVar295 = vsubps_avx(auVar295,auVar20);
  auVar169 = vminps_avx(auVar158,auVar194);
  auVar158 = vmaxps_avx(auVar158,auVar194);
  auVar15 = vminps_avx(auVar157,auVar295);
  auVar15 = vminps_avx(auVar169,auVar15);
  auVar169 = vmaxps_avx(auVar157,auVar295);
  auVar158 = vmaxps_avx(auVar158,auVar169);
  auVar309._0_4_ = fVar144 * auVar15._0_4_;
  auVar309._4_4_ = fVar144 * auVar15._4_4_;
  auVar309._8_4_ = fVar144 * auVar15._8_4_;
  auVar309._12_4_ = fVar144 * auVar15._12_4_;
  auVar296._0_4_ = fVar144 * auVar158._0_4_;
  auVar296._4_4_ = fVar144 * auVar158._4_4_;
  auVar296._8_4_ = fVar144 * auVar158._8_4_;
  auVar296._12_4_ = fVar144 * auVar158._12_4_;
  auVar295 = vinsertps_avx(auVar16,auVar123,0x10);
  auVar194 = vinsertps_avx(auVar17,auVar124,0x10);
  auVar285._0_4_ = (auVar295._0_4_ + auVar194._0_4_) * 0.5;
  auVar285._4_4_ = (auVar295._4_4_ + auVar194._4_4_) * 0.5;
  auVar285._8_4_ = (auVar295._8_4_ + auVar194._8_4_) * 0.5;
  auVar285._12_4_ = (auVar295._12_4_ + auVar194._12_4_) * 0.5;
  auVar85._4_4_ = auVar285._0_4_;
  auVar85._0_4_ = auVar285._0_4_;
  auVar85._8_4_ = auVar285._0_4_;
  auVar85._12_4_ = auVar285._0_4_;
  auVar158 = vfmadd213ps_fma(local_338,auVar85,_local_4e8);
  auVar169 = vfmadd213ps_fma(_local_348,auVar85,auVar18);
  auVar15 = vfmadd213ps_fma(local_1e8,auVar85,auVar19);
  auVar17 = vsubps_avx(auVar169,auVar158);
  auVar158 = vfmadd213ps_fma(auVar17,auVar85,auVar158);
  auVar17 = vsubps_avx(auVar15,auVar169);
  auVar17 = vfmadd213ps_fma(auVar17,auVar85,auVar169);
  auVar17 = vsubps_avx(auVar17,auVar158);
  auVar158 = vfmadd231ps_fma(auVar158,auVar17,auVar85);
  auVar86._0_8_ = CONCAT44(auVar17._4_4_ * 3.0,auVar17._0_4_ * 3.0);
  auVar86._8_4_ = auVar17._8_4_ * 3.0;
  auVar86._12_4_ = auVar17._12_4_ * 3.0;
  auVar318._8_8_ = auVar158._0_8_;
  auVar318._0_8_ = auVar158._0_8_;
  auVar17 = vshufpd_avx(auVar158,auVar158,3);
  auVar158 = vshufps_avx(auVar285,auVar285,0x55);
  auVar283 = vsubps_avx(auVar17,auVar318);
  auVar69 = vfmadd231ps_fma(auVar318,auVar158,auVar283);
  auVar323._8_8_ = auVar86._0_8_;
  auVar323._0_8_ = auVar86._0_8_;
  auVar17 = vshufpd_avx(auVar86,auVar86,3);
  auVar17 = vsubps_avx(auVar17,auVar323);
  auVar20 = vfmadd213ps_fma(auVar17,auVar158,auVar323);
  auVar158 = vmovshdup_avx(auVar20);
  auVar324._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
  auVar324._8_4_ = auVar158._8_4_ ^ 0x80000000;
  auVar324._12_4_ = auVar158._12_4_ ^ 0x80000000;
  auVar169 = vmovshdup_avx(auVar283);
  auVar17 = vunpcklps_avx(auVar169,auVar324);
  auVar15 = vshufps_avx(auVar17,auVar324,4);
  auVar157 = vshufps_avx(auVar285,auVar285,0x54);
  auVar160._0_8_ = auVar283._0_8_ ^ 0x8000000080000000;
  auVar160._8_4_ = auVar283._8_4_ ^ 0x80000000;
  auVar160._12_4_ = auVar283._12_4_ ^ 0x80000000;
  auVar17 = vmovlhps_avx(auVar160,auVar20);
  auVar17 = vshufps_avx(auVar17,auVar20,8);
  auVar158 = vfmsub231ss_fma(ZEXT416((uint)(auVar283._0_4_ * auVar158._0_4_)),auVar169,auVar20);
  uVar65 = auVar158._0_4_;
  auVar87._4_4_ = uVar65;
  auVar87._0_4_ = uVar65;
  auVar87._8_4_ = uVar65;
  auVar87._12_4_ = uVar65;
  auVar158 = vdivps_avx(auVar15,auVar87);
  auVar169 = vdivps_avx(auVar17,auVar87);
  fVar92 = auVar69._0_4_;
  fVar144 = auVar158._0_4_;
  auVar17 = vshufps_avx(auVar69,auVar69,0x55);
  fVar143 = auVar169._0_4_;
  auVar88._0_4_ = fVar92 * fVar144 + auVar17._0_4_ * fVar143;
  auVar88._4_4_ = fVar92 * auVar158._4_4_ + auVar17._4_4_ * auVar169._4_4_;
  auVar88._8_4_ = fVar92 * auVar158._8_4_ + auVar17._8_4_ * auVar169._8_4_;
  auVar88._12_4_ = fVar92 * auVar158._12_4_ + auVar17._12_4_ * auVar169._12_4_;
  auVar98 = vsubps_avx(auVar157,auVar88);
  auVar157 = vmovshdup_avx(auVar158);
  auVar17 = vinsertps_avx(auVar269,auVar309,0x1c);
  auVar195._0_4_ = auVar157._0_4_ * auVar17._0_4_;
  auVar195._4_4_ = auVar157._4_4_ * auVar17._4_4_;
  auVar195._8_4_ = auVar157._8_4_ * auVar17._8_4_;
  auVar195._12_4_ = auVar157._12_4_ * auVar17._12_4_;
  auVar15 = vinsertps_avx(auVar253,auVar296,0x1c);
  auVar112._0_4_ = auVar15._0_4_ * auVar157._0_4_;
  auVar112._4_4_ = auVar15._4_4_ * auVar157._4_4_;
  auVar112._8_4_ = auVar15._8_4_ * auVar157._8_4_;
  auVar112._12_4_ = auVar15._12_4_ * auVar157._12_4_;
  auVar69 = vminps_avx(auVar195,auVar112);
  auVar20 = vmaxps_avx(auVar112,auVar195);
  auVar157 = vinsertps_avx(auVar309,auVar269,0x4c);
  auVar154 = vmovshdup_avx(auVar169);
  auVar283 = vinsertps_avx(auVar296,auVar253,0x4c);
  auVar297._0_4_ = auVar154._0_4_ * auVar157._0_4_;
  auVar297._4_4_ = auVar154._4_4_ * auVar157._4_4_;
  auVar297._8_4_ = auVar154._8_4_ * auVar157._8_4_;
  auVar297._12_4_ = auVar154._12_4_ * auVar157._12_4_;
  auVar270._0_4_ = auVar154._0_4_ * auVar283._0_4_;
  auVar270._4_4_ = auVar154._4_4_ * auVar283._4_4_;
  auVar270._8_4_ = auVar154._8_4_ * auVar283._8_4_;
  auVar270._12_4_ = auVar154._12_4_ * auVar283._12_4_;
  auVar154 = vminps_avx(auVar297,auVar270);
  auVar310._0_4_ = auVar69._0_4_ + auVar154._0_4_;
  auVar310._4_4_ = auVar69._4_4_ + auVar154._4_4_;
  auVar310._8_4_ = auVar69._8_4_ + auVar154._8_4_;
  auVar310._12_4_ = auVar69._12_4_ + auVar154._12_4_;
  auVar69 = vmaxps_avx(auVar270,auVar297);
  auVar113._0_4_ = auVar69._0_4_ + auVar20._0_4_;
  auVar113._4_4_ = auVar69._4_4_ + auVar20._4_4_;
  auVar113._8_4_ = auVar69._8_4_ + auVar20._8_4_;
  auVar113._12_4_ = auVar69._12_4_ + auVar20._12_4_;
  auVar271._8_8_ = 0x3f80000000000000;
  auVar271._0_8_ = 0x3f80000000000000;
  auVar20 = vsubps_avx(auVar271,auVar113);
  auVar69 = vsubps_avx(auVar271,auVar310);
  auVar154 = vsubps_avx(auVar295,auVar285);
  auVar97 = vsubps_avx(auVar194,auVar285);
  auVar133._0_4_ = fVar144 * auVar17._0_4_;
  auVar133._4_4_ = fVar144 * auVar17._4_4_;
  auVar133._8_4_ = fVar144 * auVar17._8_4_;
  auVar133._12_4_ = fVar144 * auVar17._12_4_;
  auVar311._0_4_ = fVar144 * auVar15._0_4_;
  auVar311._4_4_ = fVar144 * auVar15._4_4_;
  auVar311._8_4_ = fVar144 * auVar15._8_4_;
  auVar311._12_4_ = fVar144 * auVar15._12_4_;
  auVar15 = vminps_avx(auVar133,auVar311);
  auVar17 = vmaxps_avx(auVar311,auVar133);
  auVar196._0_4_ = fVar143 * auVar157._0_4_;
  auVar196._4_4_ = fVar143 * auVar157._4_4_;
  auVar196._8_4_ = fVar143 * auVar157._8_4_;
  auVar196._12_4_ = fVar143 * auVar157._12_4_;
  auVar254._0_4_ = fVar143 * auVar283._0_4_;
  auVar254._4_4_ = fVar143 * auVar283._4_4_;
  auVar254._8_4_ = fVar143 * auVar283._8_4_;
  auVar254._12_4_ = fVar143 * auVar283._12_4_;
  auVar157 = vminps_avx(auVar196,auVar254);
  auVar312._0_4_ = auVar15._0_4_ + auVar157._0_4_;
  auVar312._4_4_ = auVar15._4_4_ + auVar157._4_4_;
  auVar312._8_4_ = auVar15._8_4_ + auVar157._8_4_;
  auVar312._12_4_ = auVar15._12_4_ + auVar157._12_4_;
  fVar140 = auVar154._0_4_;
  auVar319._0_4_ = fVar140 * auVar20._0_4_;
  fVar141 = auVar154._4_4_;
  auVar319._4_4_ = fVar141 * auVar20._4_4_;
  fVar164 = auVar154._8_4_;
  auVar319._8_4_ = fVar164 * auVar20._8_4_;
  fVar180 = auVar154._12_4_;
  auVar319._12_4_ = fVar180 * auVar20._12_4_;
  auVar15 = vmaxps_avx(auVar254,auVar196);
  auVar255._0_4_ = fVar140 * auVar69._0_4_;
  auVar255._4_4_ = fVar141 * auVar69._4_4_;
  auVar255._8_4_ = fVar164 * auVar69._8_4_;
  auVar255._12_4_ = fVar180 * auVar69._12_4_;
  fVar92 = auVar97._0_4_;
  auVar114._0_4_ = fVar92 * auVar20._0_4_;
  fVar142 = auVar97._4_4_;
  auVar114._4_4_ = fVar142 * auVar20._4_4_;
  fVar122 = auVar97._8_4_;
  auVar114._8_4_ = fVar122 * auVar20._8_4_;
  fVar139 = auVar97._12_4_;
  auVar114._12_4_ = fVar139 * auVar20._12_4_;
  auVar272._0_4_ = fVar92 * auVar69._0_4_;
  auVar272._4_4_ = fVar142 * auVar69._4_4_;
  auVar272._8_4_ = fVar122 * auVar69._8_4_;
  auVar272._12_4_ = fVar139 * auVar69._12_4_;
  auVar134._0_4_ = auVar17._0_4_ + auVar15._0_4_;
  auVar134._4_4_ = auVar17._4_4_ + auVar15._4_4_;
  auVar134._8_4_ = auVar17._8_4_ + auVar15._8_4_;
  auVar134._12_4_ = auVar17._12_4_ + auVar15._12_4_;
  auVar197._8_8_ = 0x3f800000;
  auVar197._0_8_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar197,auVar134);
  auVar15 = vsubps_avx(auVar197,auVar312);
  auVar313._0_4_ = fVar140 * auVar17._0_4_;
  auVar313._4_4_ = fVar141 * auVar17._4_4_;
  auVar313._8_4_ = fVar164 * auVar17._8_4_;
  auVar313._12_4_ = fVar180 * auVar17._12_4_;
  auVar298._0_4_ = fVar140 * auVar15._0_4_;
  auVar298._4_4_ = fVar141 * auVar15._4_4_;
  auVar298._8_4_ = fVar164 * auVar15._8_4_;
  auVar298._12_4_ = fVar180 * auVar15._12_4_;
  auVar135._0_4_ = fVar92 * auVar17._0_4_;
  auVar135._4_4_ = fVar142 * auVar17._4_4_;
  auVar135._8_4_ = fVar122 * auVar17._8_4_;
  auVar135._12_4_ = fVar139 * auVar17._12_4_;
  auVar198._0_4_ = fVar92 * auVar15._0_4_;
  auVar198._4_4_ = fVar142 * auVar15._4_4_;
  auVar198._8_4_ = fVar122 * auVar15._8_4_;
  auVar198._12_4_ = fVar139 * auVar15._12_4_;
  auVar17 = vminps_avx(auVar313,auVar298);
  auVar15 = vminps_avx(auVar135,auVar198);
  auVar17 = vminps_avx(auVar17,auVar15);
  auVar15 = vmaxps_avx(auVar298,auVar313);
  auVar157 = vmaxps_avx(auVar198,auVar135);
  auVar283 = vminps_avx(auVar319,auVar255);
  auVar20 = vminps_avx(auVar114,auVar272);
  auVar283 = vminps_avx(auVar283,auVar20);
  auVar17 = vhaddps_avx(auVar17,auVar283);
  auVar15 = vmaxps_avx(auVar157,auVar15);
  auVar157 = vmaxps_avx(auVar255,auVar319);
  auVar283 = vmaxps_avx(auVar272,auVar114);
  auVar157 = vmaxps_avx(auVar283,auVar157);
  auVar15 = vhaddps_avx(auVar15,auVar157);
  auVar17 = vshufps_avx(auVar17,auVar17,0xe8);
  auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
  auVar273._0_4_ = auVar98._0_4_ + auVar17._0_4_;
  auVar273._4_4_ = auVar98._4_4_ + auVar17._4_4_;
  auVar273._8_4_ = auVar98._8_4_ + auVar17._8_4_;
  auVar273._12_4_ = auVar98._12_4_ + auVar17._12_4_;
  auVar256._0_4_ = auVar98._0_4_ + auVar15._0_4_;
  auVar256._4_4_ = auVar98._4_4_ + auVar15._4_4_;
  auVar256._8_4_ = auVar98._8_4_ + auVar15._8_4_;
  auVar256._12_4_ = auVar98._12_4_ + auVar15._12_4_;
  auVar259 = ZEXT1664(auVar256);
  auVar17 = vmaxps_avx(auVar295,auVar273);
  auVar15 = vminps_avx(auVar256,auVar194);
  auVar17 = vcmpps_avx(auVar15,auVar17,1);
  auVar17 = vshufps_avx(auVar17,auVar17,0x50);
  if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar17[0xf] < '\0')
  goto LAB_01236312;
  bVar61 = 0;
  if ((auVar232._0_4_ < auVar273._0_4_) && (bVar61 = 0, auVar256._0_4_ < auVar194._0_4_)) {
    auVar15 = vmovshdup_avx(auVar273);
    auVar17 = vcmpps_avx(auVar256,auVar194,1);
    bVar61 = auVar17[4] & auVar123._0_4_ < auVar15._0_4_;
  }
  auVar259 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar59 || fVar68 < 0.001) | bVar61) != 1) goto LAB_01237175;
  lVar67 = 0xc9;
  do {
    lVar67 = lVar67 + -1;
    if (lVar67 == 0) goto LAB_01236312;
    fVar142 = auVar98._0_4_;
    fVar92 = 1.0 - fVar142;
    fVar68 = fVar92 * fVar92 * fVar92;
    fVar94 = fVar142 * 3.0 * fVar92 * fVar92;
    fVar92 = fVar92 * fVar142 * fVar142 * 3.0;
    auVar177._4_4_ = fVar68;
    auVar177._0_4_ = fVar68;
    auVar177._8_4_ = fVar68;
    auVar177._12_4_ = fVar68;
    auVar136._4_4_ = fVar94;
    auVar136._0_4_ = fVar94;
    auVar136._8_4_ = fVar94;
    auVar136._12_4_ = fVar94;
    auVar115._4_4_ = fVar92;
    auVar115._0_4_ = fVar92;
    auVar115._8_4_ = fVar92;
    auVar115._12_4_ = fVar92;
    fVar142 = fVar142 * fVar142 * fVar142;
    auVar199._0_4_ = (float)local_1f8._0_4_ * fVar142;
    auVar199._4_4_ = (float)local_1f8._4_4_ * fVar142;
    auVar199._8_4_ = fStack_1f0 * fVar142;
    auVar199._12_4_ = fStack_1ec * fVar142;
    auVar16 = vfmadd231ps_fma(auVar199,auVar19,auVar115);
    auVar16 = vfmadd231ps_fma(auVar16,auVar18,auVar136);
    auVar16 = vfmadd231ps_fma(auVar16,_local_4e8,auVar177);
    auVar116._8_8_ = auVar16._0_8_;
    auVar116._0_8_ = auVar16._0_8_;
    auVar16 = vshufpd_avx(auVar16,auVar16,3);
    auVar17 = vshufps_avx(auVar98,auVar98,0x55);
    auVar16 = vsubps_avx(auVar16,auVar116);
    auVar17 = vfmadd213ps_fma(auVar16,auVar17,auVar116);
    fVar68 = auVar17._0_4_;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar117._0_4_ = fVar144 * fVar68 + fVar143 * auVar16._0_4_;
    auVar117._4_4_ = auVar158._4_4_ * fVar68 + auVar169._4_4_ * auVar16._4_4_;
    auVar117._8_4_ = auVar158._8_4_ * fVar68 + auVar169._8_4_ * auVar16._8_4_;
    auVar117._12_4_ = auVar158._12_4_ * fVar68 + auVar169._12_4_ * auVar16._12_4_;
    auVar98 = vsubps_avx(auVar98,auVar117);
    auVar16 = vandps_avx(local_2b8,auVar17);
    auVar17 = vshufps_avx(auVar16,auVar16,0xf5);
    auVar16 = vmaxss_avx(auVar17,auVar16);
  } while ((float)local_208._0_4_ <= auVar16._0_4_);
  fVar68 = auVar98._0_4_;
  if ((fVar68 < 0.0) || (1.0 < fVar68)) goto LAB_01236312;
  auVar16 = vmovshdup_avx(auVar98);
  fVar94 = auVar16._0_4_;
  if ((fVar94 < 0.0) || (1.0 < fVar94)) goto LAB_01236312;
  auVar16 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar157 = vinsertps_avx(auVar16,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar16 = vsubps_avx(local_358,(undefined1  [16])aVar5);
  auVar16 = vdpps_avx(auVar16,auVar157,0x7f);
  auVar17 = vsubps_avx(local_3b8,(undefined1  [16])aVar5);
  auVar17 = vdpps_avx(auVar17,auVar157,0x7f);
  auVar158 = vsubps_avx(local_368,(undefined1  [16])aVar5);
  auVar158 = vdpps_avx(auVar158,auVar157,0x7f);
  auVar169 = vsubps_avx(local_378,(undefined1  [16])aVar5);
  auVar169 = vdpps_avx(auVar169,auVar157,0x7f);
  auVar15 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
  auVar15 = vdpps_avx(auVar15,auVar157,0x7f);
  auVar295 = vsubps_avx(_local_3c8,(undefined1  [16])aVar5);
  auVar295 = vdpps_avx(auVar295,auVar157,0x7f);
  auVar194 = vsubps_avx(_local_3d8,(undefined1  [16])aVar5);
  auVar194 = vdpps_avx(auVar194,auVar157,0x7f);
  auVar283 = vsubps_avx(_local_3e8,(undefined1  [16])aVar5);
  auVar157 = vdpps_avx(auVar283,auVar157,0x7f);
  fVar144 = 1.0 - fVar94;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar94)),ZEXT416((uint)fVar144),auVar16);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar295._0_4_ * fVar94)),ZEXT416((uint)fVar144),auVar17)
  ;
  auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar194._0_4_ * fVar94)),ZEXT416((uint)fVar144),
                             auVar158);
  auVar259 = ZEXT1664(auVar158);
  auVar169 = vfmadd231ss_fma(ZEXT416((uint)(fVar94 * auVar157._0_4_)),ZEXT416((uint)fVar144),
                             auVar169);
  fVar92 = 1.0 - fVar68;
  fVar94 = fVar92 * fVar68 * fVar68 * 3.0;
  fVar122 = fVar68 * fVar68 * fVar68;
  auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar169._0_4_ * fVar122)),ZEXT416((uint)fVar94),
                             auVar158);
  fVar144 = fVar68 * 3.0 * fVar92 * fVar92;
  auVar17 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar144),auVar17);
  fVar143 = fVar92 * fVar92 * fVar92;
  auVar16 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar143),auVar16);
  fVar142 = auVar16._0_4_;
  if (((fVar142 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
      (fVar139 = (ray->super_RayK<1>).tfar, fVar139 < fVar142)) ||
     (pGVar7 = (context->scene->geometries).items[uVar57].ptr,
     (pGVar7->mask & (ray->super_RayK<1>).mask) == 0)) goto LAB_01236312;
  auVar16 = vshufps_avx(auVar98,auVar98,0x55);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = 0x3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar243,auVar16);
  fVar140 = auVar16._0_4_;
  auVar257._0_4_ = fVar140 * (float)local_388._0_4_;
  fVar141 = auVar16._4_4_;
  auVar257._4_4_ = fVar141 * (float)local_388._4_4_;
  fVar164 = auVar16._8_4_;
  auVar257._8_4_ = fVar164 * fStack_380;
  fVar180 = auVar16._12_4_;
  auVar257._12_4_ = fVar180 * fStack_37c;
  auVar274._0_4_ = fVar140 * (float)local_3c8._0_4_;
  auVar274._4_4_ = fVar141 * (float)local_3c8._4_4_;
  auVar274._8_4_ = fVar164 * fStack_3c0;
  auVar274._12_4_ = fVar180 * fStack_3bc;
  auVar286._0_4_ = fVar140 * (float)local_3d8._0_4_;
  auVar286._4_4_ = fVar141 * (float)local_3d8._4_4_;
  auVar286._8_4_ = fVar164 * fStack_3d0;
  auVar286._12_4_ = fVar180 * fStack_3cc;
  auVar227._0_4_ = fVar140 * (float)local_3e8._0_4_;
  auVar227._4_4_ = fVar141 * (float)local_3e8._4_4_;
  auVar227._8_4_ = fVar164 * fStack_3e0;
  auVar227._12_4_ = fVar180 * fStack_3dc;
  auVar16 = vfmadd231ps_fma(auVar257,auVar17,local_358);
  auVar158 = vfmadd231ps_fma(auVar274,auVar17,local_3b8);
  auVar169 = vfmadd231ps_fma(auVar286,auVar17,local_368);
  auVar15 = vfmadd231ps_fma(auVar227,auVar17,local_378);
  auVar16 = vsubps_avx(auVar158,auVar16);
  auVar17 = vsubps_avx(auVar169,auVar158);
  auVar259 = ZEXT1664(auVar17);
  auVar158 = vsubps_avx(auVar15,auVar169);
  auVar287._0_4_ = fVar68 * auVar17._0_4_;
  auVar287._4_4_ = fVar68 * auVar17._4_4_;
  auVar287._8_4_ = fVar68 * auVar17._8_4_;
  auVar287._12_4_ = fVar68 * auVar17._12_4_;
  auVar216._4_4_ = fVar92;
  auVar216._0_4_ = fVar92;
  auVar216._8_4_ = fVar92;
  auVar216._12_4_ = fVar92;
  auVar16 = vfmadd231ps_fma(auVar287,auVar216,auVar16);
  auVar228._0_4_ = fVar68 * auVar158._0_4_;
  auVar228._4_4_ = fVar68 * auVar158._4_4_;
  auVar228._8_4_ = fVar68 * auVar158._8_4_;
  auVar228._12_4_ = fVar68 * auVar158._12_4_;
  auVar158 = vfmadd231ps_fma(auVar228,auVar216,auVar17);
  auVar229._0_4_ = fVar68 * auVar158._0_4_;
  auVar229._4_4_ = fVar68 * auVar158._4_4_;
  auVar229._8_4_ = fVar68 * auVar158._8_4_;
  auVar229._12_4_ = fVar68 * auVar158._12_4_;
  auVar158 = vfmadd231ps_fma(auVar229,auVar216,auVar16);
  auVar200._0_4_ = fVar122 * (float)local_258._0_4_;
  auVar200._4_4_ = fVar122 * (float)local_258._4_4_;
  auVar200._8_4_ = fVar122 * fStack_250;
  auVar200._12_4_ = fVar122 * fStack_24c;
  auVar137._4_4_ = fVar94;
  auVar137._0_4_ = fVar94;
  auVar137._8_4_ = fVar94;
  auVar137._12_4_ = fVar94;
  auVar16 = vfmadd132ps_fma(auVar137,auVar200,local_248);
  auVar178._4_4_ = fVar144;
  auVar178._0_4_ = fVar144;
  auVar178._8_4_ = fVar144;
  auVar178._12_4_ = fVar144;
  auVar16 = vfmadd132ps_fma(auVar178,auVar16,local_238);
  auVar201._0_4_ = auVar158._0_4_ * 3.0;
  auVar201._4_4_ = auVar158._4_4_ * 3.0;
  auVar201._8_4_ = auVar158._8_4_ * 3.0;
  auVar201._12_4_ = auVar158._12_4_ * 3.0;
  auVar161._4_4_ = fVar143;
  auVar161._0_4_ = fVar143;
  auVar161._8_4_ = fVar143;
  auVar161._12_4_ = fVar143;
  auVar158 = vfmadd132ps_fma(auVar161,auVar16,local_228);
  auVar16 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar138._0_4_ = auVar158._0_4_ * auVar16._0_4_;
  auVar138._4_4_ = auVar158._4_4_ * auVar16._4_4_;
  auVar138._8_4_ = auVar158._8_4_ * auVar16._8_4_;
  auVar138._12_4_ = auVar158._12_4_ * auVar16._12_4_;
  auVar16 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar158 = vfmsub231ps_fma(auVar138,auVar201,auVar16);
  auVar16 = vshufps_avx(auVar158,auVar158,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar142;
    uVar95 = vmovlps_avx(auVar16);
    *(undefined8 *)&(ray->Ng).field_0 = uVar95;
    (ray->Ng).field_0.field_0.z = auVar158._0_4_;
    uVar95 = vmovlps_avx(auVar98);
    ray->u = (float)(int)uVar95;
    ray->v = (float)(int)((ulong)uVar95 >> 0x20);
    ray->primID = (uint)local_430;
    ray->geomID = uVar57;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01236312;
  }
  local_298 = vmovlps_avx(auVar16);
  local_290 = auVar158._0_4_;
  local_28c = vmovlps_avx(auVar98);
  local_284 = (uint)local_430;
  local_280 = uVar57;
  local_27c = context->user->instID[0];
  local_278 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar142;
  local_4ec = -1;
  local_2f8.valid = &local_4ec;
  local_2f8.geometryUserPtr = pGVar7->userPtr;
  local_2f8.context = context->user;
  local_2f8.ray = (RTCRayN *)ray;
  local_2f8.hit = (RTCHitN *)&local_298;
  local_2f8.N = 1;
  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    auVar259 = ZEXT1664(auVar17);
    (*pGVar7->intersectionFilterN)(&local_2f8);
    if (*local_2f8.valid == 0) goto LAB_01237111;
  }
  p_Var13 = context->args->filter;
  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
    auVar259 = ZEXT1664(auVar259._0_16_);
    (*p_Var13)(&local_2f8);
    if (*local_2f8.valid == 0) {
LAB_01237111:
      (ray->super_RayK<1>).tfar = fVar139;
      goto LAB_01236312;
    }
  }
  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).components[0] = *(float *)local_2f8.hit;
  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.y = *(float *)(local_2f8.hit + 4);
  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.z = *(float *)(local_2f8.hit + 8);
  *(float *)((long)local_2f8.ray + 0x3c) = *(float *)(local_2f8.hit + 0xc);
  *(float *)((long)local_2f8.ray + 0x40) = *(float *)(local_2f8.hit + 0x10);
  *(float *)((long)local_2f8.ray + 0x44) = *(float *)(local_2f8.hit + 0x14);
  *(float *)((long)local_2f8.ray + 0x48) = *(float *)(local_2f8.hit + 0x18);
  *(float *)((long)local_2f8.ray + 0x4c) = *(float *)(local_2f8.hit + 0x1c);
  *(float *)((long)local_2f8.ray + 0x50) = *(float *)(local_2f8.hit + 0x20);
  goto LAB_01236312;
LAB_01237175:
  local_218 = vinsertps_avx(auVar16,ZEXT416((uint)fVar94),0x10);
  auVar77 = vinsertps_avx(auVar123,ZEXT416((uint)auVar124._0_4_),0x10);
  goto LAB_01235d63;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }